

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O3

void embree::sse42::
     BVHNIntersectorKHybrid<4,_4,_16777232,_true,_embree::sse42::ArrayIntersectorK_1<4,_embree::sse42::QuadMiMBIntersectorKPluecker<4,_4,_true>_>,_true>
     ::occluded(vint<4> *valid_i,Intersectors *This,RayK<4> *ray,RayQueryContext *context)

{
  float *pfVar1;
  undefined4 *puVar2;
  uint uVar3;
  BVH *bvh;
  size_t sVar4;
  Geometry *pGVar5;
  long lVar6;
  Ref<embree::Geometry> *pRVar7;
  RTCFilterFunctionN p_Var8;
  undefined8 uVar9;
  bool bVar10;
  bool bVar11;
  bool bVar12;
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined4 uVar20;
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [12];
  undefined8 uVar24;
  undefined8 uVar25;
  undefined8 uVar26;
  undefined8 uVar27;
  undefined4 uVar28;
  AABBNodeMB4D *node1;
  ulong uVar29;
  ulong uVar30;
  undefined8 uVar31;
  ulong uVar32;
  int iVar33;
  long lVar34;
  NodeRef root;
  size_t sVar35;
  vuint<4> *v;
  ulong uVar36;
  ulong uVar37;
  ulong uVar38;
  ulong in_R10;
  long lVar39;
  NodeRef *pNVar40;
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *paVar41;
  QuadMesh *mesh;
  ulong uVar42;
  bool bVar43;
  int iVar44;
  float fVar45;
  float fVar46;
  float fVar47;
  float fVar68;
  float fVar71;
  vint4 ai;
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  float fVar74;
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  float fVar69;
  float fVar70;
  float fVar72;
  float fVar73;
  float fVar75;
  float fVar76;
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  float fVar77;
  float fVar78;
  float fVar93;
  float fVar95;
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  float fVar94;
  float fVar96;
  float fVar97;
  float fVar98;
  undefined1 auVar83 [16];
  anon_union_16_2_9473010e_for_vint_impl<4>_1 aVar84;
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  anon_union_16_2_9473010e_for_vint_impl<4>_1 aVar89;
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  float fVar99;
  float fVar112;
  float fVar114;
  undefined1 auVar101 [16];
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 aVar102;
  undefined1 auVar103 [16];
  float fVar100;
  float fVar113;
  float fVar115;
  float fVar116;
  float fVar117;
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  float fVar118;
  float fVar127;
  float fVar128;
  undefined1 auVar119 [16];
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 aVar120;
  float fVar129;
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined4 uVar130;
  float fVar131;
  float fVar134;
  float fVar135;
  vint4 ai_1;
  float fVar136;
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  float fVar137;
  float fVar138;
  float fVar140;
  float fVar142;
  vint4 ai_3;
  float fVar141;
  float fVar143;
  float fVar144;
  float fVar145;
  undefined1 auVar139 [16];
  float fVar146;
  float fVar154;
  float fVar156;
  vint4 bi_3;
  undefined1 auVar147 [16];
  float fVar155;
  float fVar157;
  float fVar158;
  float fVar159;
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  float fVar160;
  float fVar161;
  float fVar162;
  float fVar166;
  float fVar168;
  vint4 bi;
  float fVar167;
  float fVar169;
  float fVar170;
  float fVar171;
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  float fVar172;
  float fVar173;
  float fVar177;
  float fVar179;
  vint4 bi_1;
  undefined1 auVar174 [16];
  float fVar178;
  float fVar180;
  float fVar181;
  float fVar182;
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  float fVar183;
  float fVar189;
  uint uVar190;
  vint4 ai_2;
  uint uVar192;
  undefined1 auVar184 [16];
  float fVar191;
  float fVar193;
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  uint uVar194;
  uint uVar195;
  float fVar196;
  uint uVar199;
  uint uVar202;
  vint4 bi_2;
  uint uVar200;
  float fVar201;
  uint uVar203;
  float fVar204;
  uint uVar205;
  uint uVar206;
  float fVar207;
  float fVar208;
  undefined1 auVar197 [16];
  undefined1 auVar198 [16];
  float fVar209;
  float fVar210;
  float fVar211;
  float fVar215;
  float fVar216;
  float fVar217;
  float fVar218;
  float fVar219;
  float fVar220;
  undefined1 auVar212 [16];
  undefined1 auVar213 [16];
  float fVar221;
  float fVar222;
  float fVar223;
  float fVar227;
  float fVar228;
  undefined1 auVar224 [16];
  undefined1 auVar225 [16];
  float fVar229;
  undefined1 auVar226 [16];
  float fVar230;
  float fVar232;
  float fVar233;
  undefined1 in_XMM14 [16];
  float fVar234;
  undefined1 auVar231 [16];
  float fVar235;
  float fVar238;
  float fVar239;
  float fVar240;
  undefined1 auVar236 [16];
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 aVar237;
  TravRayK<4,_true> *tray_00;
  undefined1 local_1ab8 [8];
  float fStack_1ab0;
  float fStack_1aac;
  uint local_1a98;
  uint uStack_1a94;
  uint uStack_1a90;
  uint uStack_1a8c;
  vuint<4> *v_1;
  Precalculations pre;
  vint<4> itime;
  Vec3<embree::vfloat_impl<4>_> p1;
  float local_1a28;
  float fStack_1a24;
  float fStack_1a20;
  float local_1a08;
  float fStack_1a04;
  float fStack_1a00;
  float fStack_19fc;
  float local_19f8;
  float fStack_19f4;
  float fStack_19f0;
  float fStack_19ec;
  float local_19e8;
  float fStack_19e4;
  float fStack_19e0;
  float fStack_19dc;
  vbool<4> terminated;
  undefined1 local_19a8 [8];
  undefined8 uStack_19a0;
  Vec3<embree::vfloat_impl<4>_> p0;
  float local_18b8;
  float fStack_18b4;
  float fStack_18b0;
  float fStack_18ac;
  undefined8 local_18a8;
  undefined8 uStack_18a0;
  TravRayK<4,_true> tray;
  NodeRef stack_node [241];
  vfloat<4> stack_near [241];
  undefined1 auVar214 [16];
  
  uVar27 = mm_lookupmask_ps._248_8_;
  uVar26 = mm_lookupmask_ps._240_8_;
  uVar25 = mm_lookupmask_ps._8_8_;
  uVar24 = mm_lookupmask_ps._0_8_;
  bvh = (BVH *)This->ptr;
  stack_node[1].ptr = (bvh->root).ptr;
  if (stack_node[1].ptr != 8) {
    auVar86._8_4_ = 0xffffffff;
    auVar86._0_8_ = 0xffffffffffffffff;
    auVar86._12_4_ = 0xffffffff;
    auVar147 = *(undefined1 (*) [16])(ray + 0x80);
    auVar55._0_12_ = ZEXT812(0);
    auVar55._12_4_ = 0.0;
    auVar79._0_4_ = -(uint)((valid_i->field_0).i[0] == -1 && 0.0 <= auVar147._0_4_);
    auVar79._4_4_ = -(uint)((valid_i->field_0).i[1] == -1 && 0.0 <= auVar147._4_4_);
    auVar79._8_4_ = -(uint)((valid_i->field_0).i[2] == -1 && 0.0 <= auVar147._8_4_);
    auVar79._12_4_ = -(uint)((valid_i->field_0).i[3] == -1 && 0.0 <= auVar147._12_4_);
    iVar33 = movmskps((int)context,auVar79);
    if (iVar33 != 0) {
      tray.org.field_0._0_8_ = *(undefined8 *)ray;
      tray.org.field_0._8_8_ = *(undefined8 *)(ray + 8);
      tray.org.field_0._16_8_ = *(undefined8 *)(ray + 0x10);
      tray.org.field_0._24_8_ = *(undefined8 *)(ray + 0x18);
      tray.org.field_0._32_8_ = *(undefined8 *)(ray + 0x20);
      tray.org.field_0._40_8_ = *(undefined8 *)(ray + 0x28);
      tray.dir.field_0.field_0.x.field_0 = (vfloat_impl<4>)*(undefined1 (*) [16])(ray + 0x40);
      tray.dir.field_0.field_0.y.field_0 = (vfloat_impl<4>)*(undefined1 (*) [16])(ray + 0x50);
      tray.dir.field_0.field_0.z.field_0 = (vfloat_impl<4>)*(undefined1 (*) [16])(ray + 0x60);
      uVar194 = (uint)DAT_01f7b6c0;
      uVar199 = DAT_01f7b6c0._4_4_;
      uVar202 = DAT_01f7b6c0._8_4_;
      uVar205 = DAT_01f7b6c0._12_4_;
      auVar174 = divps(_DAT_01f7ba10,(undefined1  [16])tray.dir.field_0.field_0.x.field_0);
      fVar209 = (float)DAT_01f80d30;
      fVar215 = DAT_01f80d30._4_4_;
      fVar218 = DAT_01f80d30._8_4_;
      fVar219 = DAT_01f80d30._12_4_;
      auVar101._4_4_ = -(uint)((float)(tray.dir.field_0._4_4_ & uVar199) < fVar215);
      auVar101._0_4_ = -(uint)((float)(tray.dir.field_0._0_4_ & uVar194) < fVar209);
      auVar101._8_4_ = -(uint)((float)(tray.dir.field_0._8_4_ & uVar202) < fVar218);
      auVar101._12_4_ = -(uint)((float)(tray.dir.field_0._12_4_ & uVar205) < fVar219);
      auVar119 = divps(_DAT_01f7ba10,(undefined1  [16])tray.dir.field_0.field_0.y.field_0);
      iVar33 = -(uint)((float)(tray.dir.field_0._24_4_ & uVar202) < fVar218);
      iVar44 = -(uint)((float)(tray.dir.field_0._28_4_ & uVar205) < fVar219);
      auVar56._0_8_ =
           CONCAT44(-(uint)((float)(tray.dir.field_0._20_4_ & uVar199) < fVar215),
                    -(uint)((float)(tray.dir.field_0._16_4_ & uVar194) < fVar209));
      auVar56._8_4_ = (float)iVar33;
      auVar56._12_4_ = (float)iVar44;
      auVar80 = divps(_DAT_01f7ba10,(undefined1  [16])tray.dir.field_0.field_0.z.field_0);
      tray.rdir.field_0.field_0.x.field_0 =
           (vfloat_impl<4>)blendvps(auVar174,_DAT_01fab950,auVar101);
      auVar174._8_4_ = iVar33;
      auVar174._0_8_ = auVar56._0_8_;
      auVar174._12_4_ = iVar44;
      tray.rdir.field_0.field_0.y.field_0 =
           (vfloat_impl<4>)blendvps(auVar119,_DAT_01fab950,auVar174);
      auVar119._4_4_ = -(uint)((float)(tray.dir.field_0._36_4_ & uVar199) < fVar215);
      auVar119._0_4_ = -(uint)((float)(tray.dir.field_0._32_4_ & uVar194) < fVar209);
      auVar119._8_4_ = -(uint)((float)(tray.dir.field_0._40_4_ & uVar202) < fVar218);
      auVar119._12_4_ = -(uint)((float)(tray.dir.field_0._44_4_ & uVar205) < fVar219);
      tray.rdir.field_0.field_0.z.field_0 = (vfloat_impl<4>)blendvps(auVar80,_DAT_01fab950,auVar119)
      ;
      tray.nearXYZ.field_0._0_8_ =
           CONCAT44(-(uint)(tray.rdir.field_0._4_4_ < 0.0),-(uint)(tray.rdir.field_0._0_4_ < 0.0)) &
           0x1000000010;
      tray.nearXYZ.field_0._8_4_ = -(uint)(tray.rdir.field_0._8_4_ < 0.0) & 0x10;
      tray.nearXYZ.field_0._12_4_ = -(uint)(tray.rdir.field_0._12_4_ < 0.0) & 0x10;
      auVar80._4_4_ = -(uint)(0.0 <= tray.rdir.field_0._20_4_);
      auVar80._0_4_ = -(uint)(0.0 <= tray.rdir.field_0._16_4_);
      auVar80._8_4_ = -(uint)(0.0 <= tray.rdir.field_0._24_4_);
      auVar80._12_4_ = -(uint)(0.0 <= tray.rdir.field_0._28_4_);
      tray.nearXYZ.field_0.field_0.y.field_0 =
           (vint_impl<4>)blendvps(_DAT_01faeed0,_DAT_01f8c1f0,auVar80);
      auVar48._4_4_ = -(uint)(0.0 <= tray.rdir.field_0._36_4_);
      auVar48._0_4_ = -(uint)(0.0 <= tray.rdir.field_0._32_4_);
      auVar48._8_4_ = -(uint)(0.0 <= tray.rdir.field_0._40_4_);
      auVar48._12_4_ = -(uint)(0.0 <= tray.rdir.field_0._44_4_);
      tray.nearXYZ.field_0.field_0.z.field_0 =
           (vint_impl<4>)blendvps(_DAT_01faeef0,_DAT_01faeee0,auVar48);
      auVar101 = maxps(*(undefined1 (*) [16])(ray + 0x30),auVar55);
      tray.tnear.field_0 =
           (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
           blendvps((undefined1  [16])_DAT_01f7a9f0,auVar101,auVar79);
      auVar147 = maxps(auVar147,auVar55);
      tray.tfar.field_0 =
           (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)blendvps(_DAT_01f7aa00,auVar147,auVar79);
      terminated.field_0 = (anon_union_16_2_9473010e_for_vboolf_impl<4>_1)(auVar86 ^ auVar79);
      if (context->user == (RTCRayQueryContext *)0x0) {
        uVar194 = 3;
      }
      else {
        uVar194 = ((context->args->flags & RTC_RAY_QUERY_FLAG_COHERENT) ==
                  RTC_RAY_QUERY_FLAG_INCOHERENT) + 2;
      }
      pNVar40 = stack_node + 2;
      stack_node[0].ptr = 0xfffffffffffffff8;
      paVar41 = &stack_near[2].field_0;
      stack_near[0].field_0 = _DAT_01f7a9f0;
      stack_near[1].field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)tray.tnear;
      uVar199 = 0x21d2f80;
      auVar147 = _DAT_01f7b6c0;
      _local_1ab8 = _DAT_01f80d30;
      aVar237 = _DAT_01f7a9f0;
LAB_0023adce:
      do {
        do {
          root.ptr = pNVar40[-1].ptr;
          if (root.ptr == 0xfffffffffffffff8) goto LAB_0023c8d2;
          pNVar40 = pNVar40 + -1;
          paVar41 = paVar41 + -1;
          aVar102.v = *(__m128 *)paVar41->v;
          auVar49._4_4_ = -(uint)(aVar102._4_4_ < tray.tfar.field_0.v[1]);
          auVar49._0_4_ = -(uint)(aVar102._0_4_ < tray.tfar.field_0.v[0]);
          auVar49._8_4_ = -(uint)(aVar102._8_4_ < tray.tfar.field_0.v[2]);
          auVar49._12_4_ = -(uint)(aVar102._12_4_ < tray.tfar.field_0.v[3]);
          uVar199 = movmskps(uVar199,auVar49);
        } while (uVar199 == 0);
        uVar29 = (ulong)(byte)uVar199;
        uVar202 = uVar199 & 0xff;
        if (uVar194 < (uint)POPCOUNT(uVar202)) {
LAB_0023ae14:
          do {
            uVar202 = (uint)root.ptr;
            fVar209 = aVar102.v[0];
            fVar215 = aVar102.v[1];
            fVar218 = aVar102.v[2];
            fVar219 = aVar102.v[3];
            if ((root.ptr & 8) != 0) {
              if (root.ptr == 0xfffffffffffffff8) goto LAB_0023c8d2;
              auVar52._4_4_ = -(uint)(fVar215 < tray.tfar.field_0.v[1]);
              auVar52._0_4_ = -(uint)(fVar209 < tray.tfar.field_0.v[0]);
              auVar52._8_4_ = -(uint)(fVar218 < tray.tfar.field_0.v[2]);
              auVar52._12_4_ = -(uint)(fVar219 < tray.tfar.field_0.v[3]);
              uVar199 = movmskps(uVar199,auVar52);
              if (uVar199 != 0) {
                uVar29 = (ulong)(uVar202 & 0xf);
                uVar199 = terminated.field_0._0_4_;
                uVar202 = terminated.field_0._4_4_;
                uVar205 = terminated.field_0._8_4_;
                uVar190 = terminated.field_0._12_4_;
                if (uVar29 == 8) {
                  uVar28 = 0;
                }
                else {
                  uVar199 = uVar199 ^ 0xffffffff;
                  uVar202 = uVar202 ^ 0xffffffff;
                  uVar205 = uVar205 ^ 0xffffffff;
                  uVar190 = uVar190 ^ 0xffffffff;
                  uVar32 = 0;
                  do {
                    lVar34 = uVar32 * 0x60 + (root.ptr & 0xfffffffffffffff0);
                    auVar13._4_4_ = uVar202;
                    auVar13._0_4_ = uVar199;
                    auVar13._8_4_ = uVar205;
                    auVar13._12_4_ = uVar190;
                    uVar28 = movmskps((int)in_R10,auVar13);
                    in_R10 = CONCAT44((int)(in_R10 >> 0x20),uVar28);
                    auVar90._4_4_ = uVar202;
                    auVar90._0_4_ = uVar199;
                    auVar90._8_4_ = uVar205;
                    auVar90._12_4_ = uVar190;
                    uVar42 = 0;
                    while( true ) {
                      auVar86 = _DAT_01f7b6c0;
                      aVar102 = _DAT_01f7a9f0;
                      uVar192 = *(uint *)(lVar34 + 0x50 + uVar42 * 4);
                      uVar30 = (ulong)uVar192;
                      if (uVar192 == 0xffffffff) break;
                      pGVar5 = (context->scene->geometries).items
                               [*(uint *)(lVar34 + 0x40 + uVar42 * 4)].ptr;
                      fVar209 = pGVar5->fnumTimeSegments;
                      fVar215 = (pGVar5->time_range).lower;
                      auVar103._0_4_ = (pGVar5->time_range).upper - fVar215;
                      auVar81._4_4_ = fVar215;
                      auVar81._0_4_ = fVar215;
                      auVar81._8_4_ = fVar215;
                      auVar81._12_4_ = fVar215;
                      auVar224._0_4_ = *(float *)(ray + 0x70) - fVar215;
                      auVar224._4_4_ = *(float *)(ray + 0x74) - fVar215;
                      auVar224._8_4_ = *(float *)(ray + 0x78) - fVar215;
                      auVar224._12_4_ = *(float *)(ray + 0x7c) - fVar215;
                      auVar103._4_4_ = auVar103._0_4_;
                      auVar103._8_4_ = auVar103._0_4_;
                      auVar103._12_4_ = auVar103._0_4_;
                      auVar101 = divps(auVar224,auVar103);
                      auVar225._0_4_ = auVar101._0_4_ * fVar209;
                      auVar225._4_4_ = auVar101._4_4_ * fVar209;
                      auVar225._8_4_ = auVar101._8_4_ * fVar209;
                      auVar225._12_4_ = auVar101._12_4_ * fVar209;
                      auVar101 = roundps(auVar81,auVar225,1);
                      auVar53._0_4_ = fVar209 + -1.0;
                      auVar53._4_4_ = auVar53._0_4_;
                      auVar53._8_4_ = auVar53._0_4_;
                      auVar53._12_4_ = auVar53._0_4_;
                      auVar101 = minps(auVar101,auVar53);
                      auVar101 = maxps(auVar101,ZEXT816(0));
                      fVar209 = auVar225._0_4_ - auVar101._0_4_;
                      fVar215 = auVar225._4_4_ - auVar101._4_4_;
                      fVar218 = auVar225._8_4_ - auVar101._8_4_;
                      fVar219 = auVar225._12_4_ - auVar101._12_4_;
                      itime.field_0.i[0] = (int)auVar101._0_4_;
                      itime.field_0.i[1] = (int)auVar101._4_4_;
                      itime.field_0.i[2] = (int)auVar101._8_4_;
                      itime.field_0.i[3] = (int)auVar101._12_4_;
                      uVar30 = 0;
                      if (in_R10 != 0) {
                        for (; (in_R10 >> uVar30 & 1) == 0; uVar30 = uVar30 + 1) {
                        }
                      }
                      iVar33 = itime.field_0.i[uVar30];
                      auVar82._0_4_ = -(uint)(iVar33 == itime.field_0.i[0]);
                      auVar82._4_4_ = -(uint)(iVar33 == itime.field_0.i[1]);
                      auVar82._8_4_ = -(uint)(iVar33 == itime.field_0.i[2]);
                      auVar82._12_4_ = -(uint)(iVar33 == itime.field_0.i[3]);
                      auVar14._4_4_ = uVar202;
                      auVar14._0_4_ = uVar199;
                      auVar14._8_4_ = uVar205;
                      auVar14._12_4_ = uVar190;
                      uVar195 = movmskps((int)valid_i,~auVar82 & auVar14);
                      valid_i = (vint<4> *)(ulong)uVar195;
                      if (uVar195 == 0) {
                        uVar30 = *(ulong *)(*(long *)&pGVar5[2].numPrimitives + (long)iVar33 * 0x38)
                        ;
                        lVar6 = *(long *)(*(long *)&pGVar5[2].numPrimitives + 0x38 +
                                         (long)iVar33 * 0x38);
                        uVar37 = (ulong)*(uint *)(lVar34 + uVar42 * 4);
                        uVar38 = (ulong)*(uint *)(lVar34 + 0x10 + uVar42 * 4);
                        pfVar1 = (float *)(uVar30 + uVar37 * 4);
                        fVar74 = *pfVar1;
                        fVar137 = pfVar1[1];
                        fVar146 = pfVar1[2];
                        pfVar1 = (float *)(lVar6 + uVar37 * 4);
                        fVar140 = *pfVar1;
                        fVar154 = pfVar1[1];
                        fVar156 = pfVar1[2];
                        fVar46 = 1.0 - fVar209;
                        fVar69 = 1.0 - fVar215;
                        fVar72 = 1.0 - fVar218;
                        fVar75 = 1.0 - fVar219;
                        fVar230 = fVar74 * fVar46 + fVar140 * fVar209;
                        fVar232 = fVar74 * fVar69 + fVar140 * fVar215;
                        fVar233 = fVar74 * fVar72 + fVar140 * fVar218;
                        fVar234 = fVar74 * fVar75 + fVar140 * fVar219;
                        fVar158 = fVar137 * fVar46 + fVar154 * fVar209;
                        fVar181 = fVar137 * fVar69 + fVar154 * fVar215;
                        fVar221 = fVar137 * fVar72 + fVar154 * fVar218;
                        fVar222 = fVar137 * fVar75 + fVar154 * fVar219;
                        fVar154 = fVar146 * fVar46 + fVar156 * fVar209;
                        fVar142 = fVar146 * fVar69 + fVar156 * fVar215;
                        fVar144 = fVar146 * fVar72 + fVar156 * fVar218;
                        fVar156 = fVar146 * fVar75 + fVar156 * fVar219;
                        pfVar1 = (float *)(uVar30 + uVar38 * 4);
                        fVar74 = *pfVar1;
                        fVar137 = pfVar1[1];
                        fVar146 = pfVar1[2];
                        pfVar1 = (float *)(lVar6 + uVar38 * 4);
                        fVar140 = *pfVar1;
                        fVar99 = pfVar1[1];
                        fVar112 = pfVar1[2];
                        fVar45 = fVar74 * fVar46 + fVar140 * fVar209;
                        fVar68 = fVar74 * fVar69 + fVar140 * fVar215;
                        fVar71 = fVar74 * fVar72 + fVar140 * fVar218;
                        fVar160 = fVar74 * fVar75 + fVar140 * fVar219;
                        fVar177 = fVar137 * fVar46 + fVar99 * fVar209;
                        fVar179 = fVar137 * fVar69 + fVar99 * fVar215;
                        fVar216 = fVar137 * fVar72 + fVar99 * fVar218;
                        fVar220 = fVar137 * fVar75 + fVar99 * fVar219;
                        fVar166 = fVar146 * fVar46 + fVar112 * fVar209;
                        fVar168 = fVar146 * fVar69 + fVar112 * fVar215;
                        fVar170 = fVar146 * fVar72 + fVar112 * fVar218;
                        fVar172 = fVar146 * fVar75 + fVar112 * fVar219;
                        uVar38 = (ulong)*(uint *)(lVar34 + 0x20 + uVar42 * 4);
                        pfVar1 = (float *)(uVar30 + uVar38 * 4);
                        fVar74 = *pfVar1;
                        fVar137 = pfVar1[1];
                        fVar146 = pfVar1[2];
                        pfVar1 = (float *)(lVar6 + uVar38 * 4);
                        fVar140 = *pfVar1;
                        fVar99 = pfVar1[1];
                        fVar112 = pfVar1[2];
                        local_1ab8._4_4_ = fVar74 * fVar69 + fVar140 * fVar215;
                        local_1ab8._0_4_ = fVar74 * fVar46 + fVar140 * fVar209;
                        fStack_1ab0 = fVar74 * fVar72 + fVar140 * fVar218;
                        fStack_1aac = fVar74 * fVar75 + fVar140 * fVar219;
                        local_19f8 = fVar137 * fVar46 + fVar99 * fVar209;
                        fStack_19f4 = fVar137 * fVar69 + fVar99 * fVar215;
                        fStack_19f0 = fVar137 * fVar72 + fVar99 * fVar218;
                        fStack_19ec = fVar137 * fVar75 + fVar99 * fVar219;
                        local_1a08 = fVar146 * fVar46 + fVar112 * fVar209;
                        fStack_1a04 = fVar146 * fVar69 + fVar112 * fVar215;
                        fStack_1a00 = fVar146 * fVar72 + fVar112 * fVar218;
                        fStack_19fc = fVar146 * fVar75 + fVar112 * fVar219;
                        valid_i = (vint<4> *)(ulong)*(uint *)(lVar34 + 0x30 + uVar42 * 4);
                        pfVar1 = (float *)(lVar6 + (long)valid_i * 4);
                        fVar74 = *pfVar1;
                        fVar137 = pfVar1[1];
                        fVar146 = pfVar1[2];
                        pfVar1 = (float *)(uVar30 + (long)valid_i * 4);
                        fVar140 = *pfVar1;
                        fVar116 = pfVar1[1];
                        fVar162 = pfVar1[2];
                        fVar196 = fVar140 * fVar46 + fVar74 * fVar209;
                        fVar201 = fVar140 * fVar69 + fVar74 * fVar215;
                        fVar204 = fVar140 * fVar72 + fVar74 * fVar218;
                        fVar207 = fVar140 * fVar75 + fVar74 * fVar219;
                        fVar99 = fVar116 * fVar46 + fVar137 * fVar209;
                        fVar112 = fVar116 * fVar69 + fVar137 * fVar215;
                        fVar114 = fVar116 * fVar72 + fVar137 * fVar218;
                        fVar116 = fVar116 * fVar75 + fVar137 * fVar219;
                        fVar209 = fVar162 * fVar46 + fVar146 * fVar209;
                        fVar215 = fVar162 * fVar69 + fVar146 * fVar215;
                        fVar218 = fVar162 * fVar72 + fVar146 * fVar218;
                        fVar219 = fVar162 * fVar75 + fVar146 * fVar219;
                      }
                      else {
                        if (in_R10 != 0) {
                          lVar6 = *(long *)&pGVar5[2].numPrimitives;
                          uVar36 = (ulong)*(uint *)(lVar34 + uVar42 * 4);
                          uVar37 = in_R10;
                          uVar38 = uVar30;
                          do {
                            lVar39 = (long)itime.field_0.i[uVar38] * 0x38;
                            valid_i = *(vint<4> **)(lVar6 + lVar39);
                            auVar101 = *(undefined1 (*) [16])
                                        ((long)&((Intersectors *)valid_i)->ptr + uVar36 * 4);
                            auVar174 = *(undefined1 (*) [16])
                                        (*(long *)(lVar6 + 0x38 + lVar39) + uVar36 * 4);
                            *(int *)((long)&p0.field_0 + uVar38 * 4) = auVar101._0_4_;
                            uVar31 = extractps(auVar101,1);
                            *(undefined8 *)((long)&p0.field_0 + uVar38 * 4 + 0x10) = uVar31;
                            uVar31 = extractps(auVar101,2);
                            *(undefined8 *)((long)&p0.field_0 + uVar38 * 4 + 0x20) = uVar31;
                            *(int *)((long)&p1.field_0 + uVar38 * 4) = auVar174._0_4_;
                            uVar31 = extractps(auVar174,1);
                            *(undefined8 *)((long)&p1.field_0 + uVar38 * 4 + 0x10) = uVar31;
                            uVar31 = extractps(auVar174,2);
                            *(undefined8 *)((long)&p1.field_0 + uVar38 * 4 + 0x20) = uVar31;
                            uVar37 = uVar37 ^ 1L << (uVar38 & 0x3f);
                            uVar38 = 0;
                            if (uVar37 != 0) {
                              for (; (uVar37 >> uVar38 & 1) == 0; uVar38 = uVar38 + 1) {
                              }
                            }
                          } while (uVar37 != 0);
                          uStack_19a0._4_4_ = p1.field_0._12_4_;
                          uStack_19a0._0_4_ = p1.field_0._8_4_;
                          local_19a8 = (undefined1  [8])p1.field_0._0_8_;
                          in_XMM14 = (undefined1  [16])p0.field_0.field_0.x.field_0;
                        }
                        fVar74 = 1.0 - fVar209;
                        fVar137 = 1.0 - fVar215;
                        fVar146 = 1.0 - fVar218;
                        fVar140 = 1.0 - fVar219;
                        fVar158 = (float)p0.field_0._16_4_ * fVar74;
                        fVar181 = (float)p0.field_0._20_4_ * fVar137;
                        fVar221 = (float)p0.field_0._24_4_ * fVar146;
                        fVar222 = (float)p0.field_0._28_4_ * fVar140;
                        fVar154 = (float)p0.field_0._32_4_ * fVar74;
                        fVar142 = (float)p0.field_0._36_4_ * fVar137;
                        fVar144 = (float)p0.field_0._40_4_ * fVar146;
                        fVar156 = (float)p0.field_0._44_4_ * fVar140;
                        fVar99 = (float)p1.field_0._16_4_ * fVar209;
                        fVar112 = (float)p1.field_0._20_4_ * fVar215;
                        auVar133._4_4_ = fVar112;
                        auVar133._0_4_ = fVar99;
                        fVar114 = (float)p1.field_0._24_4_ * fVar218;
                        fVar116 = (float)p1.field_0._28_4_ * fVar219;
                        fVar45 = (float)p1.field_0._32_4_ * fVar209;
                        fVar68 = (float)p1.field_0._36_4_ * fVar215;
                        fVar71 = (float)p1.field_0._40_4_ * fVar218;
                        fVar160 = (float)p1.field_0._44_4_ * fVar219;
                        if (in_R10 != 0) {
                          auVar133._8_4_ = fVar114;
                          auVar133._12_4_ = fVar116;
                          lVar6 = *(long *)&pGVar5[2].numPrimitives;
                          uVar36 = (ulong)*(uint *)(lVar34 + 0x10 + uVar42 * 4);
                          uVar37 = in_R10;
                          uVar38 = uVar30;
                          do {
                            lVar39 = (long)itime.field_0.i[uVar38] * 0x38;
                            valid_i = *(vint<4> **)(lVar6 + lVar39);
                            auVar56 = *(undefined1 (*) [16])
                                       ((long)&((Intersectors *)valid_i)->ptr + uVar36 * 4);
                            puVar2 = (undefined4 *)(*(long *)(lVar6 + 0x38 + lVar39) + uVar36 * 4);
                            uVar28 = *puVar2;
                            uVar130 = puVar2[1];
                            uVar20 = puVar2[2];
                            *(int *)((long)&p0.field_0 + uVar38 * 4) = auVar56._0_4_;
                            uVar31 = extractps(auVar56,1);
                            *(undefined8 *)((long)&p0.field_0 + uVar38 * 4 + 0x10) = uVar31;
                            uVar31 = extractps(auVar56,2);
                            *(undefined8 *)((long)&p0.field_0 + uVar38 * 4 + 0x20) = uVar31;
                            *(undefined4 *)((long)&p1.field_0 + uVar38 * 4) = uVar28;
                            *(undefined4 *)((long)&p1.field_0 + uVar38 * 4 + 0x10) = uVar130;
                            *(undefined4 *)((long)&p1.field_0 + uVar38 * 4 + 0x20) = uVar20;
                            uVar37 = uVar37 ^ 1L << (uVar38 & 0x3f);
                            uVar38 = 0;
                            if (uVar37 != 0) {
                              for (; (uVar37 >> uVar38 & 1) == 0; uVar38 = uVar38 + 1) {
                              }
                            }
                          } while (uVar37 != 0);
                          local_18a8 = p1.field_0._0_8_;
                          uStack_18a0 = CONCAT44(p1.field_0._12_4_,p1.field_0._8_4_);
                          auVar56 = auVar133;
                          _local_1ab8 = (undefined1  [16])p0.field_0.field_0.x.field_0;
                        }
                        fVar177 = (float)p0.field_0._16_4_ * fVar74;
                        fVar179 = (float)p0.field_0._20_4_ * fVar137;
                        fVar216 = (float)p0.field_0._24_4_ * fVar146;
                        fVar220 = (float)p0.field_0._28_4_ * fVar140;
                        fVar166 = (float)p0.field_0._32_4_ * fVar74;
                        fVar168 = (float)p0.field_0._36_4_ * fVar137;
                        fVar170 = (float)p0.field_0._40_4_ * fVar146;
                        fVar172 = (float)p0.field_0._44_4_ * fVar140;
                        fVar196 = (float)p1.field_0._16_4_ * fVar209;
                        fVar201 = (float)p1.field_0._20_4_ * fVar215;
                        fVar204 = (float)p1.field_0._24_4_ * fVar218;
                        fVar207 = (float)p1.field_0._28_4_ * fVar219;
                        fVar162 = (float)p1.field_0._32_4_ * fVar209;
                        fVar46 = (float)p1.field_0._36_4_ * fVar215;
                        fVar69 = (float)p1.field_0._40_4_ * fVar218;
                        fVar72 = (float)p1.field_0._44_4_ * fVar219;
                        uVar28 = fVar204;
                        uVar130 = fVar207;
                        uVar31 = CONCAT44(fVar201,fVar196);
                        if (in_R10 != 0) {
                          lVar6 = *(long *)&pGVar5[2].numPrimitives;
                          uVar36 = (ulong)*(uint *)(lVar34 + 0x20 + uVar42 * 4);
                          uVar37 = in_R10;
                          uVar38 = uVar30;
                          do {
                            lVar39 = (long)itime.field_0.i[uVar38] * 0x38;
                            valid_i = *(vint<4> **)(lVar6 + lVar39);
                            auVar55 = *(undefined1 (*) [16])
                                       ((long)&((Intersectors *)valid_i)->ptr + uVar36 * 4);
                            auVar101 = *(undefined1 (*) [16])
                                        (*(long *)(lVar6 + 0x38 + lVar39) + uVar36 * 4);
                            *(int *)((long)&p0.field_0 + uVar38 * 4) = auVar55._0_4_;
                            uVar31 = extractps(auVar55,1);
                            *(undefined8 *)((long)&p0.field_0 + uVar38 * 4 + 0x10) = uVar31;
                            uVar31 = extractps(auVar55,2);
                            *(undefined8 *)((long)&p0.field_0 + uVar38 * 4 + 0x20) = uVar31;
                            *(int *)((long)&p1.field_0 + uVar38 * 4) = auVar101._0_4_;
                            uVar31 = extractps(auVar101,1);
                            *(undefined8 *)((long)&p1.field_0 + uVar38 * 4 + 0x10) = uVar31;
                            uVar31 = extractps(auVar101,2);
                            *(undefined8 *)((long)&p1.field_0 + uVar38 * 4 + 0x20) = uVar31;
                            uVar37 = uVar37 ^ 1L << (uVar38 & 0x3f);
                            uVar38 = 0;
                            if (uVar37 != 0) {
                              for (; (uVar37 >> uVar38 & 1) == 0; uVar38 = uVar38 + 1) {
                              }
                            }
                            auVar55 = (undefined1  [16])p0.field_0.field_0.x.field_0;
                            uVar28 = p1.field_0._8_4_;
                            uVar130 = p1.field_0._12_4_;
                            uVar31 = p1.field_0._0_8_;
                          } while (uVar37 != 0);
                        }
                        local_19f8 = (float)p0.field_0._16_4_ * fVar74;
                        fStack_19f4 = (float)p0.field_0._20_4_ * fVar137;
                        fStack_19f0 = (float)p0.field_0._24_4_ * fVar146;
                        fStack_19ec = (float)p0.field_0._28_4_ * fVar140;
                        local_1a08 = (float)p0.field_0._32_4_ * fVar74;
                        fStack_1a04 = (float)p0.field_0._36_4_ * fVar137;
                        fStack_1a00 = (float)p0.field_0._40_4_ * fVar146;
                        fStack_19fc = (float)p0.field_0._44_4_ * fVar140;
                        fVar75 = (float)p1.field_0._16_4_ * fVar209;
                        fVar155 = (float)p1.field_0._20_4_ * fVar215;
                        fVar157 = (float)p1.field_0._24_4_ * fVar218;
                        fVar159 = (float)p1.field_0._28_4_ * fVar219;
                        fVar208 = (float)p1.field_0._32_4_ * fVar209;
                        fVar210 = (float)p1.field_0._36_4_ * fVar215;
                        fVar211 = (float)p1.field_0._40_4_ * fVar218;
                        fVar217 = (float)p1.field_0._44_4_ * fVar219;
                        if (in_R10 != 0) {
                          lVar6 = *(long *)&pGVar5[2].numPrimitives;
                          valid_i = (vint<4> *)(lVar6 + 0x38);
                          uVar37 = (ulong)*(uint *)(lVar34 + 0x30 + uVar42 * 4);
                          uVar38 = in_R10;
                          do {
                            auVar147 = *(undefined1 (*) [16])
                                        (*(long *)(lVar6 + (long)itime.field_0.i[uVar30] * 0x38) +
                                        uVar37 * 4);
                            auVar56 = *(undefined1 (*) [16])
                                       ((long)&((&((Intersectors *)valid_i)->ptr)
                                                [(long)itime.field_0.i[uVar30] * 7]->super_RefCount)
                                               ._vptr_RefCount + uVar37 * 4);
                            *(int *)((long)&p0.field_0 + uVar30 * 4) = auVar147._0_4_;
                            uVar9 = extractps(auVar147,1);
                            *(undefined8 *)((long)&p0.field_0 + uVar30 * 4 + 0x10) = uVar9;
                            uVar9 = extractps(auVar147,2);
                            *(undefined8 *)((long)&p0.field_0 + uVar30 * 4 + 0x20) = uVar9;
                            *(int *)((long)&p1.field_0 + uVar30 * 4) = auVar56._0_4_;
                            uVar9 = extractps(auVar56,1);
                            *(undefined8 *)((long)&p1.field_0 + uVar30 * 4 + 0x10) = uVar9;
                            uVar9 = extractps(auVar56,2);
                            *(undefined8 *)((long)&p1.field_0 + uVar30 * 4 + 0x20) = uVar9;
                            uVar38 = uVar38 ^ 1L << (uVar30 & 0x3f);
                            uVar30 = 0;
                            if (uVar38 != 0) {
                              for (; (uVar38 >> uVar30 & 1) == 0; uVar30 = uVar30 + 1) {
                              }
                            }
                          } while (uVar38 != 0);
                          auVar147._8_4_ = (float)p1.field_0._8_4_;
                          auVar147._0_8_ = p1.field_0._0_8_;
                          auVar147._12_4_ = (float)p1.field_0._12_4_;
                          auVar56 = (undefined1  [16])p0.field_0.field_0.x.field_0;
                        }
                        fVar230 = (float)local_19a8._0_4_ * fVar209 + in_XMM14._0_4_ * fVar74;
                        fVar232 = (float)local_19a8._4_4_ * fVar215 + in_XMM14._4_4_ * fVar137;
                        fVar233 = (float)(undefined4)uStack_19a0 * fVar218 +
                                  in_XMM14._8_4_ * fVar146;
                        fVar234 = (float)uStack_19a0._4_4_ * fVar219 + in_XMM14._12_4_ * fVar140;
                        fVar158 = fVar158 + fVar99;
                        fVar181 = fVar181 + fVar112;
                        fVar221 = fVar221 + fVar114;
                        fVar222 = fVar222 + fVar116;
                        fVar154 = fVar154 + fVar45;
                        fVar142 = fVar142 + fVar68;
                        fVar144 = fVar144 + fVar71;
                        fVar156 = fVar156 + fVar160;
                        fVar45 = (float)local_18a8 * fVar209 + local_1ab8._0_4_ * fVar74;
                        fVar68 = local_18a8._4_4_ * fVar215 + local_1ab8._4_4_ * fVar137;
                        fVar71 = (float)uStack_18a0 * fVar218 + local_1ab8._8_4_ * fVar146;
                        fVar160 = uStack_18a0._4_4_ * fVar219 + local_1ab8._12_4_ * fVar140;
                        fVar177 = fVar177 + fVar196;
                        fVar179 = fVar179 + fVar201;
                        fVar216 = fVar216 + fVar204;
                        fVar220 = fVar220 + fVar207;
                        fVar166 = fVar166 + fVar162;
                        fVar168 = fVar168 + fVar46;
                        fVar170 = fVar170 + fVar69;
                        fVar172 = fVar172 + fVar72;
                        local_1ab8._4_4_ =
                             (float)((ulong)uVar31 >> 0x20) * fVar215 + auVar55._4_4_ * fVar137;
                        local_1ab8._0_4_ = (float)uVar31 * fVar209 + auVar55._0_4_ * fVar74;
                        fStack_1ab0 = (float)uVar28 * fVar218 + auVar55._8_4_ * fVar146;
                        fStack_1aac = (float)uVar130 * fVar219 + auVar55._12_4_ * fVar140;
                        local_19f8 = local_19f8 + fVar75;
                        fStack_19f4 = fStack_19f4 + fVar155;
                        fStack_19f0 = fStack_19f0 + fVar157;
                        fStack_19ec = fStack_19ec + fVar159;
                        local_1a08 = local_1a08 + fVar208;
                        fStack_1a04 = fStack_1a04 + fVar210;
                        fStack_1a00 = fStack_1a00 + fVar211;
                        fStack_19fc = fStack_19fc + fVar217;
                        fVar196 = auVar147._0_4_ * fVar209 + auVar56._0_4_ * fVar74;
                        fVar201 = auVar147._4_4_ * fVar215 + auVar56._4_4_ * fVar137;
                        fVar204 = auVar147._8_4_ * fVar218 + auVar56._8_4_ * fVar146;
                        fVar207 = auVar147._12_4_ * fVar219 + auVar56._12_4_ * fVar140;
                        fVar99 = (float)p1.field_0._16_4_ * fVar209 +
                                 (float)p0.field_0._16_4_ * fVar74;
                        fVar112 = (float)p1.field_0._20_4_ * fVar215 +
                                  (float)p0.field_0._20_4_ * fVar137;
                        fVar114 = (float)p1.field_0._24_4_ * fVar218 +
                                  (float)p0.field_0._24_4_ * fVar146;
                        fVar116 = (float)p1.field_0._28_4_ * fVar219 +
                                  (float)p0.field_0._28_4_ * fVar140;
                        fVar209 = fVar209 * (float)p1.field_0._32_4_ +
                                  fVar74 * (float)p0.field_0._32_4_;
                        fVar215 = fVar215 * (float)p1.field_0._36_4_ +
                                  fVar137 * (float)p0.field_0._36_4_;
                        fVar218 = fVar218 * (float)p1.field_0._40_4_ +
                                  fVar146 * (float)p0.field_0._40_4_;
                        fVar219 = fVar219 * (float)p1.field_0._44_4_ +
                                  fVar140 * (float)p0.field_0._44_4_;
                      }
                      fVar74 = *(float *)ray;
                      fVar137 = *(float *)(ray + 4);
                      fVar146 = *(float *)(ray + 8);
                      fVar140 = *(float *)(ray + 0xc);
                      fVar162 = *(float *)(ray + 0x10);
                      fVar46 = *(float *)(ray + 0x14);
                      fVar69 = *(float *)(ray + 0x18);
                      fVar72 = *(float *)(ray + 0x1c);
                      fVar75 = *(float *)(ray + 0x20);
                      fVar155 = *(float *)(ray + 0x24);
                      fVar157 = *(float *)(ray + 0x28);
                      fVar159 = *(float *)(ray + 0x2c);
                      fVar208 = *(float *)(ray + 0x40);
                      fVar210 = *(float *)(ray + 0x44);
                      fVar211 = *(float *)(ray + 0x48);
                      fVar217 = *(float *)(ray + 0x4c);
                      local_19a8._0_4_ = fVar230 - fVar74;
                      local_19a8._4_4_ = fVar232 - fVar137;
                      uStack_19a0._0_4_ = fVar233 - fVar146;
                      uStack_19a0._4_4_ = fVar234 - fVar140;
                      fVar158 = fVar158 - fVar162;
                      fVar181 = fVar181 - fVar46;
                      fVar221 = fVar221 - fVar69;
                      fVar222 = fVar222 - fVar72;
                      fVar154 = fVar154 - fVar75;
                      fVar142 = fVar142 - fVar155;
                      fVar144 = fVar144 - fVar157;
                      fVar156 = fVar156 - fVar159;
                      local_18a8 = CONCAT44(fVar68,fVar45);
                      uStack_18a0 = CONCAT44(fVar160,fVar71);
                      fVar131 = fVar45 - fVar74;
                      fVar134 = fVar68 - fVar137;
                      fVar135 = fVar71 - fVar146;
                      fVar136 = fVar160 - fVar140;
                      fVar161 = fVar177 - fVar162;
                      fVar167 = fVar179 - fVar46;
                      fVar169 = fVar216 - fVar69;
                      fVar171 = fVar220 - fVar72;
                      fVar183 = fVar166 - fVar75;
                      fVar189 = fVar168 - fVar155;
                      fVar191 = fVar170 - fVar157;
                      fVar193 = fVar172 - fVar159;
                      fVar74 = fVar196 - fVar74;
                      fVar137 = fVar201 - fVar137;
                      fVar146 = fVar204 - fVar146;
                      fVar140 = fVar207 - fVar140;
                      fVar162 = fVar99 - fVar162;
                      fVar46 = fVar112 - fVar46;
                      fVar69 = fVar114 - fVar69;
                      fVar72 = fVar116 - fVar72;
                      fVar75 = fVar209 - fVar75;
                      fVar155 = fVar215 - fVar155;
                      fVar157 = fVar218 - fVar157;
                      fVar159 = fVar219 - fVar159;
                      fVar47 = fVar74 - (float)local_19a8._0_4_;
                      fVar70 = fVar137 - (float)local_19a8._4_4_;
                      fVar73 = fVar146 - (float)(undefined4)uStack_19a0;
                      fVar76 = fVar140 - (float)uStack_19a0._4_4_;
                      fVar100 = fVar162 - fVar158;
                      fVar113 = fVar46 - fVar181;
                      fVar115 = fVar69 - fVar221;
                      fVar117 = fVar72 - fVar222;
                      fVar77 = fVar75 - fVar154;
                      fVar93 = fVar155 - fVar142;
                      fVar95 = fVar157 - fVar144;
                      fVar97 = fVar159 - fVar156;
                      fVar230 = *(float *)(ray + 0x60);
                      fVar232 = *(float *)(ray + 100);
                      fVar233 = *(float *)(ray + 0x68);
                      fVar234 = *(float *)(ray + 0x6c);
                      fVar118 = (float)local_19a8._0_4_ - fVar131;
                      fVar127 = (float)local_19a8._4_4_ - fVar134;
                      fVar128 = (float)(undefined4)uStack_19a0 - fVar135;
                      fVar129 = (float)uStack_19a0._4_4_ - fVar136;
                      local_18b8 = (float)*(undefined8 *)(ray + 0x50);
                      fStack_18b4 = (float)((ulong)*(undefined8 *)(ray + 0x50) >> 0x20);
                      fStack_18b0 = (float)*(undefined8 *)(ray + 0x58);
                      fStack_18ac = (float)((ulong)*(undefined8 *)(ray + 0x58) >> 0x20);
                      fVar173 = fVar158 - fVar161;
                      fVar178 = fVar181 - fVar167;
                      fVar180 = fVar221 - fVar169;
                      fVar182 = fVar222 - fVar171;
                      fVar235 = (fVar100 * (fVar75 + fVar154) - (fVar162 + fVar158) * fVar77) *
                                fVar208 + ((fVar74 + (float)local_19a8._0_4_) * fVar77 -
                                          (fVar75 + fVar154) * fVar47) * local_18b8 +
                                          (fVar47 * (fVar162 + fVar158) -
                                          (fVar74 + (float)local_19a8._0_4_) * fVar100) * fVar230;
                      fVar238 = (fVar113 * (fVar155 + fVar142) - (fVar46 + fVar181) * fVar93) *
                                fVar210 + ((fVar137 + (float)local_19a8._4_4_) * fVar93 -
                                          (fVar155 + fVar142) * fVar70) * fStack_18b4 +
                                          (fVar70 * (fVar46 + fVar181) -
                                          (fVar137 + (float)local_19a8._4_4_) * fVar113) * fVar232;
                      fVar239 = (fVar115 * (fVar157 + fVar144) - (fVar69 + fVar221) * fVar95) *
                                fVar211 + ((fVar146 + (float)(undefined4)uStack_19a0) * fVar95 -
                                          (fVar157 + fVar144) * fVar73) * fStack_18b0 +
                                          (fVar73 * (fVar69 + fVar221) -
                                          (fVar146 + (float)(undefined4)uStack_19a0) * fVar115) *
                                          fVar233;
                      fVar240 = (fVar117 * (fVar159 + fVar156) - (fVar72 + fVar222) * fVar97) *
                                fVar217 + ((fVar140 + (float)uStack_19a0._4_4_) * fVar97 -
                                          (fVar159 + fVar156) * fVar76) * fStack_18ac +
                                          (fVar76 * (fVar72 + fVar222) -
                                          (fVar140 + (float)uStack_19a0._4_4_) * fVar117) * fVar234;
                      fVar78 = fVar154 - fVar183;
                      fVar94 = fVar142 - fVar189;
                      fVar96 = fVar144 - fVar191;
                      fVar98 = fVar156 - fVar193;
                      auVar185._0_4_ =
                           (fVar173 * (fVar154 + fVar183) - (fVar158 + fVar161) * fVar78) * fVar208
                           + (((float)local_19a8._0_4_ + fVar131) * fVar78 -
                             (fVar154 + fVar183) * fVar118) * local_18b8 +
                             (fVar118 * (fVar158 + fVar161) -
                             ((float)local_19a8._0_4_ + fVar131) * fVar173) * fVar230;
                      auVar185._4_4_ =
                           (fVar178 * (fVar142 + fVar189) - (fVar181 + fVar167) * fVar94) * fVar210
                           + (((float)local_19a8._4_4_ + fVar134) * fVar94 -
                             (fVar142 + fVar189) * fVar127) * fStack_18b4 +
                             (fVar127 * (fVar181 + fVar167) -
                             ((float)local_19a8._4_4_ + fVar134) * fVar178) * fVar232;
                      auVar185._8_4_ =
                           (fVar180 * (fVar144 + fVar191) - (fVar221 + fVar169) * fVar96) * fVar211
                           + (((float)(undefined4)uStack_19a0 + fVar135) * fVar96 -
                             (fVar144 + fVar191) * fVar128) * fStack_18b0 +
                             (fVar128 * (fVar221 + fVar169) -
                             ((float)(undefined4)uStack_19a0 + fVar135) * fVar180) * fVar233;
                      auVar185._12_4_ =
                           (fVar182 * (fVar156 + fVar193) - (fVar222 + fVar171) * fVar98) * fVar217
                           + (((float)uStack_19a0._4_4_ + fVar136) * fVar98 -
                             (fVar156 + fVar193) * fVar129) * fStack_18ac +
                             (fVar129 * (fVar222 + fVar171) -
                             ((float)uStack_19a0._4_4_ + fVar136) * fVar182) * fVar234;
                      fVar138 = fVar131 - fVar74;
                      fVar141 = fVar134 - fVar137;
                      fVar143 = fVar135 - fVar146;
                      fVar145 = fVar136 - fVar140;
                      fVar223 = fVar161 - fVar162;
                      fVar227 = fVar167 - fVar46;
                      fVar228 = fVar169 - fVar69;
                      fVar229 = fVar171 - fVar72;
                      auVar147._0_4_ = fVar183 - fVar75;
                      auVar147._4_4_ = fVar189 - fVar155;
                      auVar147._8_4_ = fVar191 - fVar157;
                      auVar147._12_4_ = fVar193 - fVar159;
                      auVar163._0_4_ = (fVar162 + fVar161) * auVar147._0_4_;
                      auVar163._4_4_ = (fVar46 + fVar167) * auVar147._4_4_;
                      auVar163._8_4_ = (fVar69 + fVar169) * auVar147._8_4_;
                      auVar163._12_4_ = (fVar72 + fVar171) * auVar147._12_4_;
                      in_XMM14._0_4_ = (fVar74 + fVar131) * fVar223;
                      in_XMM14._4_4_ = (fVar137 + fVar134) * fVar227;
                      in_XMM14._8_4_ = (fVar146 + fVar135) * fVar228;
                      in_XMM14._12_4_ = (fVar140 + fVar136) * fVar229;
                      fVar74 = (fVar223 * (fVar75 + fVar183) - auVar163._0_4_) * fVar208 +
                               ((fVar74 + fVar131) * auVar147._0_4_ - (fVar75 + fVar183) * fVar138)
                               * local_18b8 +
                               (fVar138 * (fVar162 + fVar161) - in_XMM14._0_4_) * fVar230;
                      fVar137 = (fVar227 * (fVar155 + fVar189) - auVar163._4_4_) * fVar210 +
                                ((fVar137 + fVar134) * auVar147._4_4_ -
                                (fVar155 + fVar189) * fVar141) * fStack_18b4 +
                                (fVar141 * (fVar46 + fVar167) - in_XMM14._4_4_) * fVar232;
                      fVar146 = (fVar228 * (fVar157 + fVar191) - auVar163._8_4_) * fVar211 +
                                ((fVar146 + fVar135) * auVar147._8_4_ -
                                (fVar157 + fVar191) * fVar143) * fStack_18b0 +
                                (fVar143 * (fVar69 + fVar169) - in_XMM14._8_4_) * fVar233;
                      fVar140 = (fVar229 * (fVar159 + fVar193) - auVar163._12_4_) * fVar217 +
                                ((fVar140 + fVar136) * auVar147._12_4_ -
                                (fVar159 + fVar193) * fVar145) * fStack_18ac +
                                (fVar145 * (fVar72 + fVar171) - in_XMM14._12_4_) * fVar234;
                      auVar104._0_4_ = fVar235 + auVar185._0_4_ + fVar74;
                      auVar104._4_4_ = fVar238 + auVar185._4_4_ + fVar137;
                      auVar104._8_4_ = fVar239 + auVar185._8_4_ + fVar146;
                      auVar104._12_4_ = fVar240 + auVar185._12_4_ + fVar140;
                      auVar54._8_4_ = fVar239;
                      auVar54._0_8_ = CONCAT44(fVar238,fVar235);
                      auVar54._12_4_ = fVar240;
                      auVar55 = minps(auVar54,auVar185);
                      auVar15._4_4_ = fVar137;
                      auVar15._0_4_ = fVar74;
                      auVar15._8_4_ = fVar146;
                      auVar15._12_4_ = fVar140;
                      auVar56 = minps(auVar55,auVar15);
                      auVar148._8_4_ = fVar239;
                      auVar148._0_8_ = CONCAT44(fVar238,fVar235);
                      auVar148._12_4_ = fVar240;
                      auVar55 = maxps(auVar148,auVar185);
                      auVar16._4_4_ = fVar137;
                      auVar16._0_4_ = fVar74;
                      auVar16._8_4_ = fVar146;
                      auVar16._12_4_ = fVar140;
                      auVar101 = maxps(auVar55,auVar16);
                      uVar38 = CONCAT44(auVar104._4_4_,auVar104._0_4_);
                      auVar55._0_8_ = uVar38 & 0x7fffffff7fffffff;
                      auVar55._8_4_ = ABS(auVar104._8_4_);
                      auVar55._12_4_ = ABS(auVar104._12_4_);
                      auVar149._4_4_ =
                           -(uint)(auVar101._4_4_ <= ABS(auVar104._4_4_) * 1.1920929e-07);
                      auVar149._0_4_ =
                           -(uint)(auVar101._0_4_ <= ABS(auVar104._0_4_) * 1.1920929e-07);
                      auVar149._8_4_ = -(uint)(auVar101._8_4_ <= auVar55._8_4_ * 1.1920929e-07);
                      auVar149._12_4_ = -(uint)(auVar101._12_4_ <= auVar55._12_4_ * 1.1920929e-07);
                      auVar57._4_4_ =
                           -(uint)(-(ABS(auVar104._4_4_) * 1.1920929e-07) <= auVar56._4_4_);
                      auVar57._0_4_ =
                           -(uint)(-(ABS(auVar104._0_4_) * 1.1920929e-07) <= auVar56._0_4_);
                      auVar57._8_4_ = -(uint)(-(auVar55._8_4_ * 1.1920929e-07) <= auVar56._8_4_);
                      auVar57._12_4_ = -(uint)(-(auVar55._12_4_ * 1.1920929e-07) <= auVar56._12_4_);
                      auVar149 = auVar149 | auVar57;
                      local_1a98 = auVar90._0_4_;
                      uStack_1a94 = auVar90._4_4_;
                      uStack_1a90 = auVar90._8_4_;
                      uStack_1a8c = auVar90._12_4_;
                      auVar150._0_4_ = auVar149._0_4_ & local_1a98;
                      auVar150._4_4_ = auVar149._4_4_ & uStack_1a94;
                      auVar150._8_4_ = auVar149._8_4_ & uStack_1a90;
                      auVar150._12_4_ = auVar149._12_4_ & uStack_1a8c;
                      iVar33 = movmskps((int)uVar30,auVar150);
                      auVar56 = auVar55;
                      aVar237 = _DAT_01f7a9f0;
                      if (iVar33 == 0) {
LAB_0023bd47:
                        auVar55 = auVar163;
                        auVar226._4_4_ = fStack_19f4;
                        auVar226._0_4_ = local_19f8;
                        auVar226._8_4_ = fStack_19f0;
                        auVar226._12_4_ = fStack_19ec;
                      }
                      else {
                        auVar163._0_4_ = fVar100 * fVar78 - fVar173 * fVar77;
                        auVar163._4_4_ = fVar113 * fVar94 - fVar178 * fVar93;
                        auVar163._8_4_ = fVar115 * fVar96 - fVar180 * fVar95;
                        auVar163._12_4_ = fVar117 * fVar98 - fVar182 * fVar97;
                        auVar175._0_4_ = fVar173 * auVar147._0_4_ - fVar223 * fVar78;
                        auVar175._4_4_ = fVar178 * auVar147._4_4_ - fVar227 * fVar94;
                        auVar175._8_4_ = fVar180 * auVar147._8_4_ - fVar228 * fVar96;
                        auVar175._12_4_ = fVar182 * auVar147._12_4_ - fVar229 * fVar98;
                        uVar195 = (uint)DAT_01f7b6c0;
                        uVar200 = DAT_01f7b6c0._4_4_;
                        uVar203 = DAT_01f7b6c0._8_4_;
                        uVar206 = DAT_01f7b6c0._12_4_;
                        auVar58._4_4_ =
                             -(uint)((float)((uint)(fVar178 * fVar93) & uVar200) <
                                    (float)((uint)(fVar227 * fVar94) & uVar200));
                        auVar58._0_4_ =
                             -(uint)((float)((uint)(fVar173 * fVar77) & uVar195) <
                                    (float)((uint)(fVar223 * fVar78) & uVar195));
                        auVar58._8_4_ =
                             -(uint)((float)((uint)(fVar180 * fVar95) & uVar203) <
                                    (float)((uint)(fVar228 * fVar96) & uVar203));
                        auVar58._12_4_ =
                             -(uint)((float)((uint)(fVar182 * fVar97) & uVar206) <
                                    (float)((uint)(fVar229 * fVar98) & uVar206));
                        auVar119 = blendvps(auVar175,auVar163,auVar58);
                        auVar231._0_4_ = fVar77 * fVar118 - fVar47 * fVar78;
                        auVar231._4_4_ = fVar93 * fVar127 - fVar70 * fVar94;
                        auVar231._8_4_ = fVar95 * fVar128 - fVar73 * fVar96;
                        auVar231._12_4_ = fVar97 * fVar129 - fVar76 * fVar98;
                        auVar139._0_4_ = fVar138 * fVar78 - fVar118 * auVar147._0_4_;
                        auVar139._4_4_ = fVar141 * fVar94 - fVar127 * auVar147._4_4_;
                        auVar139._8_4_ = fVar143 * fVar96 - fVar128 * auVar147._8_4_;
                        auVar139._12_4_ = fVar145 * fVar98 - fVar129 * auVar147._12_4_;
                        auVar59._4_4_ =
                             -(uint)((float)((uint)(fVar70 * fVar94) & uVar200) <
                                    (float)((uint)(fVar127 * auVar147._4_4_) & uVar200));
                        auVar59._0_4_ =
                             -(uint)((float)((uint)(fVar47 * fVar78) & uVar195) <
                                    (float)((uint)(fVar118 * auVar147._0_4_) & uVar195));
                        auVar59._8_4_ =
                             -(uint)((float)((uint)(fVar73 * fVar96) & uVar203) <
                                    (float)((uint)(fVar128 * auVar147._8_4_) & uVar203));
                        auVar59._12_4_ =
                             -(uint)((float)((uint)(fVar76 * fVar98) & uVar206) <
                                    (float)((uint)(fVar129 * auVar147._12_4_) & uVar206));
                        auVar174 = blendvps(auVar139,auVar231,auVar59);
                        auVar186._0_4_ = fVar47 * fVar173 - fVar118 * fVar100;
                        auVar186._4_4_ = fVar70 * fVar178 - fVar127 * fVar113;
                        auVar186._8_4_ = fVar73 * fVar180 - fVar128 * fVar115;
                        auVar186._12_4_ = fVar76 * fVar182 - fVar129 * fVar117;
                        auVar121._0_4_ = fVar118 * fVar223 - fVar138 * fVar173;
                        auVar121._4_4_ = fVar127 * fVar227 - fVar141 * fVar178;
                        auVar121._8_4_ = fVar128 * fVar228 - fVar143 * fVar180;
                        auVar121._12_4_ = fVar129 * fVar229 - fVar145 * fVar182;
                        auVar60._4_4_ =
                             -(uint)((float)((uint)(fVar127 * fVar113) & uVar200) <
                                    (float)((uint)(fVar141 * fVar178) & uVar200));
                        auVar60._0_4_ =
                             -(uint)((float)((uint)(fVar118 * fVar100) & uVar195) <
                                    (float)((uint)(fVar138 * fVar173) & uVar195));
                        auVar60._8_4_ =
                             -(uint)((float)((uint)(fVar128 * fVar115) & uVar203) <
                                    (float)((uint)(fVar143 * fVar180) & uVar203));
                        auVar60._12_4_ =
                             -(uint)((float)((uint)(fVar129 * fVar117) & uVar206) <
                                    (float)((uint)(fVar145 * fVar182) & uVar206));
                        auVar101 = blendvps(auVar121,auVar186,auVar60);
                        fVar74 = fVar208 * auVar119._0_4_ +
                                 local_18b8 * auVar174._0_4_ + fVar230 * auVar101._0_4_;
                        fVar137 = fVar210 * auVar119._4_4_ +
                                  fStack_18b4 * auVar174._4_4_ + fVar232 * auVar101._4_4_;
                        fVar146 = fVar211 * auVar119._8_4_ +
                                  fStack_18b0 * auVar174._8_4_ + fVar233 * auVar101._8_4_;
                        fVar140 = fVar217 * auVar119._12_4_ +
                                  fStack_18ac * auVar174._12_4_ + fVar234 * auVar101._12_4_;
                        auVar212._0_4_ = fVar74 + fVar74;
                        auVar212._4_4_ = fVar137 + fVar137;
                        auVar212._8_4_ = fVar146 + fVar146;
                        auVar212._12_4_ = fVar140 + fVar140;
                        auVar61._0_4_ = fVar158 * auVar174._0_4_ + fVar154 * auVar101._0_4_;
                        auVar61._4_4_ = fVar181 * auVar174._4_4_ + fVar142 * auVar101._4_4_;
                        auVar61._8_4_ = fVar221 * auVar174._8_4_ + fVar144 * auVar101._8_4_;
                        auVar61._12_4_ = fVar222 * auVar174._12_4_ + fVar156 * auVar101._12_4_;
                        fVar154 = (float)local_19a8._0_4_ * auVar119._0_4_ + auVar61._0_4_;
                        fVar142 = (float)local_19a8._4_4_ * auVar119._4_4_ + auVar61._4_4_;
                        fVar144 = (float)(undefined4)uStack_19a0 * auVar119._8_4_ + auVar61._8_4_;
                        fVar156 = (float)uStack_19a0._4_4_ * auVar119._12_4_ + auVar61._12_4_;
                        auVar147 = rcpps(auVar61,auVar212);
                        fVar74 = auVar147._0_4_;
                        fVar137 = auVar147._4_4_;
                        fVar146 = auVar147._8_4_;
                        fVar140 = auVar147._12_4_;
                        auVar105._0_4_ =
                             ((1.0 - auVar212._0_4_ * fVar74) * fVar74 + fVar74) *
                             (fVar154 + fVar154);
                        auVar105._4_4_ =
                             ((1.0 - auVar212._4_4_ * fVar137) * fVar137 + fVar137) *
                             (fVar142 + fVar142);
                        auVar105._8_4_ =
                             ((1.0 - auVar212._8_4_ * fVar146) * fVar146 + fVar146) *
                             (fVar144 + fVar144);
                        auVar105._12_4_ =
                             ((1.0 - auVar212._12_4_ * fVar140) * fVar140 + fVar140) *
                             (fVar156 + fVar156);
                        in_XMM14 = *(undefined1 (*) [16])
                                    ((anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *)(ray + 0x80))
                                    ->v;
                        auVar56._0_12_ = ZEXT812(0);
                        auVar56._12_4_ = 0.0;
                        auVar213._0_4_ =
                             (int)((uint)(auVar212._0_4_ != 0.0 &&
                                         (auVar105._0_4_ <= in_XMM14._0_4_ &&
                                         *(float *)(ray + 0x30) <= auVar105._0_4_)) * -0x80000000)
                             >> 0x1f;
                        auVar213._4_4_ =
                             (int)((uint)(auVar212._4_4_ != 0.0 &&
                                         (auVar105._4_4_ <= in_XMM14._4_4_ &&
                                         *(float *)(ray + 0x34) <= auVar105._4_4_)) * -0x80000000)
                             >> 0x1f;
                        auVar213._8_4_ =
                             (int)((uint)(auVar212._8_4_ != 0.0 &&
                                         (auVar105._8_4_ <= in_XMM14._8_4_ &&
                                         *(float *)(ray + 0x38) <= auVar105._8_4_)) * -0x80000000)
                             >> 0x1f;
                        auVar213._12_4_ =
                             (int)((uint)(auVar212._12_4_ != 0.0 &&
                                         (auVar105._12_4_ <= in_XMM14._12_4_ &&
                                         *(float *)(ray + 0x3c) <= auVar105._12_4_)) * -0x80000000)
                             >> 0x1f;
                        iVar33 = movmskps(iVar33,auVar213 & auVar150);
                        auVar147 = _DAT_01f7b6c0;
                        if (iVar33 == 0) goto LAB_0023bd47;
                        uVar195 = pGVar5->mask;
                        auVar83._0_4_ = -(uint)((uVar195 & *(uint *)(ray + 0x90)) == 0);
                        auVar83._4_4_ = -(uint)((uVar195 & *(uint *)(ray + 0x94)) == 0);
                        auVar83._8_4_ = -(uint)((uVar195 & *(uint *)(ray + 0x98)) == 0);
                        auVar83._12_4_ = -(uint)((uVar195 & *(uint *)(ray + 0x9c)) == 0);
                        aVar84 = (anon_union_16_2_9473010e_for_vint_impl<4>_1)
                                 (~auVar83 & auVar213 & auVar150);
                        iVar33 = movmskps(iVar33,(undefined1  [16])aVar84);
                        auVar226._4_4_ = fStack_19f4;
                        auVar226._0_4_ = local_19f8;
                        auVar226._8_4_ = fStack_19f0;
                        auVar226._12_4_ = fStack_19ec;
                        if (iVar33 != 0) {
                          if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                             (pGVar5->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
                            auVar147 = rcpps(ZEXT416(uVar195),auVar104);
                            fVar74 = auVar147._0_4_;
                            fVar137 = auVar147._4_4_;
                            fVar146 = auVar147._8_4_;
                            fVar140 = auVar147._12_4_;
                            fVar142 = (float)DAT_01f7ba10;
                            fVar144 = DAT_01f7ba10._4_4_;
                            fVar156 = DAT_01f7ba10._12_4_;
                            fVar154 = DAT_01f7ba10._8_4_;
                            fVar74 = (float)(-(uint)(1e-18 <= (float)auVar55._0_8_) &
                                            (uint)((fVar142 - auVar104._0_4_ * fVar74) * fVar74 +
                                                  fVar74));
                            fVar137 = (float)(-(uint)(1e-18 <= (float)(auVar55._0_8_ >> 0x20)) &
                                             (uint)((fVar144 - auVar104._4_4_ * fVar137) * fVar137 +
                                                   fVar137));
                            fVar146 = (float)(-(uint)(1e-18 <= auVar55._8_4_) &
                                             (uint)((fVar154 - auVar104._8_4_ * fVar146) * fVar146 +
                                                   fVar146));
                            fVar140 = (float)(-(uint)(1e-18 <= auVar55._12_4_) &
                                             (uint)((fVar156 - auVar104._12_4_ * fVar140) * fVar140
                                                   + fVar140));
                            auVar152._0_4_ = fVar235 * fVar74;
                            auVar152._4_4_ = fVar238 * fVar137;
                            auVar152._8_4_ = fVar239 * fVar146;
                            auVar152._12_4_ = fVar240 * fVar140;
                            auVar147 = minps(auVar152,_DAT_01f7ba10);
                            auVar165._0_4_ = auVar185._0_4_ * fVar74;
                            auVar165._4_4_ = auVar185._4_4_ * fVar137;
                            auVar165._8_4_ = auVar185._8_4_ * fVar146;
                            auVar165._12_4_ = auVar185._12_4_ * fVar140;
                            auVar55 = minps(auVar165,_DAT_01f7ba10);
                            auVar125._0_4_ = fVar142 - auVar147._0_4_;
                            auVar125._4_4_ = fVar144 - auVar147._4_4_;
                            auVar125._8_4_ = fVar154 - auVar147._8_4_;
                            auVar125._12_4_ = fVar156 - auVar147._12_4_;
                            auVar22._8_8_ = uVar25;
                            auVar22._0_8_ = uVar24;
                            blendvps(auVar147,auVar125,auVar22);
                            auVar132._0_4_ = fVar142 - auVar55._0_4_;
                            auVar132._4_4_ = fVar144 - auVar55._4_4_;
                            auVar132._8_4_ = fVar154 - auVar55._8_4_;
                            auVar132._12_4_ = fVar156 - auVar55._12_4_;
                            auVar55 = blendvps(auVar55,auVar132,auVar22);
                            p0.field_0._0_16_ = auVar119;
                            p0.field_0._16_16_ = auVar174;
                            p0.field_0._32_16_ = auVar101;
                            auVar147 = blendvps(in_XMM14,auVar105,(undefined1  [16])aVar84);
                            *(undefined1 (*) [16])(ray + 0x80) = auVar147;
                            itime.field_0 = aVar84;
                            p1.field_0._0_4_ = SUB84(&itime,0);
                            p1.field_0._4_4_ = (undefined4)((ulong)&itime >> 0x20);
                            p1.field_0._8_4_ = SUB84(pGVar5->userPtr,0);
                            p1.field_0._12_4_ = (undefined4)((ulong)pGVar5->userPtr >> 0x20);
                            p1.field_0._16_8_ = context->user;
                            p1.field_0._24_8_ = ray;
                            p1.field_0._32_8_ = &p0;
                            p1.field_0._40_4_ = 4;
                            uVar31 = pGVar5->occlusionFilterN;
                            p1.field_0._0_8_ = &itime;
                            if ((RTCFilterFunctionN)uVar31 != (RTCFilterFunctionN)0x0) {
                              valid_i = (vint<4> *)&p1;
                              uVar31 = (*(code *)uVar31)((RTCFilterFunctionNArguments *)valid_i);
                              aVar102 = _DAT_01f7a9f0;
                            }
                            if (itime.field_0 == (anon_union_16_2_9473010e_for_vint_impl<4>_1)0x0) {
                              auVar110._8_4_ = 0xffffffff;
                              auVar110._0_8_ = 0xffffffffffffffff;
                              auVar110._12_4_ = 0xffffffff;
                              auVar110 = auVar110 ^ _DAT_01f7ae20;
                            }
                            else {
                              p_Var8 = context->args->filter;
                              if ((p_Var8 != (RTCFilterFunctionN)0x0) &&
                                 (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER
                                   ) != RTC_RAY_QUERY_FLAG_INCOHERENT ||
                                  (((pGVar5->field_8).field_0x2 & 0x40) != 0)))) {
                                valid_i = (vint<4> *)&p1;
                                (*p_Var8)((RTCFilterFunctionNArguments *)valid_i);
                                aVar102 = _DAT_01f7a9f0;
                              }
                              auVar92._0_4_ = -(uint)(itime.field_0._0_4_ == 0);
                              auVar92._4_4_ = -(uint)(itime.field_0._4_4_ == 0);
                              auVar92._8_4_ = -(uint)(itime.field_0._8_4_ == 0);
                              auVar92._12_4_ = -(uint)(itime.field_0._12_4_ == 0);
                              auVar110 = auVar92 ^ _DAT_01f7ae20;
                              auVar147 = blendvps(_DAT_01f7aa00,
                                                  *(undefined1 (*) [16])(p1.field_0._24_8_ + 0x80),
                                                  auVar92);
                              *(undefined1 (*) [16])(p1.field_0._24_8_ + 0x80) = auVar147;
                              uVar31 = p1.field_0._24_8_;
                            }
                            uVar192 = (uint)uVar31;
                            auVar111._0_4_ = auVar110._0_4_ << 0x1f;
                            auVar111._4_4_ = auVar110._4_4_ << 0x1f;
                            auVar111._8_4_ = auVar110._8_4_ << 0x1f;
                            auVar111._12_4_ = auVar110._12_4_ << 0x1f;
                            aVar84._0_4_ = auVar111._0_4_ >> 0x1f;
                            aVar84._4_4_ = auVar111._4_4_ >> 0x1f;
                            aVar84._8_4_ = auVar111._8_4_ >> 0x1f;
                            aVar84._12_4_ = auVar111._12_4_ >> 0x1f;
                            in_XMM14 = blendvps(in_XMM14,*(undefined1 (*) [16])(ray + 0x80),auVar111
                                               );
                            *(undefined1 (*) [16])(ray + 0x80) = in_XMM14;
                          }
                          auVar56 = auVar90;
                          auVar90 = ~(undefined1  [16])aVar84 & auVar90;
                          auVar147 = auVar86;
                          aVar237 = aVar102;
                        }
                      }
                      aVar102 = _DAT_01f7a9f0;
                      uVar192 = movmskps(uVar192,auVar90);
                      uVar30 = (ulong)uVar192;
                      if (uVar192 == 0) break;
                      fVar74 = *(float *)ray;
                      fVar137 = *(float *)(ray + 4);
                      fVar146 = *(float *)(ray + 8);
                      fVar140 = *(float *)(ray + 0xc);
                      fVar154 = *(float *)(ray + 0x10);
                      fVar142 = *(float *)(ray + 0x14);
                      fVar144 = *(float *)(ray + 0x18);
                      fVar156 = *(float *)(ray + 0x1c);
                      fVar158 = *(float *)(ray + 0x20);
                      fVar181 = *(float *)(ray + 0x24);
                      fVar221 = *(float *)(ray + 0x28);
                      fVar222 = *(float *)(ray + 0x2c);
                      auVar147 = *(undefined1 (*) [16])(ray + 0x40);
                      fVar155 = auVar147._0_4_;
                      fVar157 = auVar147._4_4_;
                      fVar159 = auVar147._8_4_;
                      fVar208 = auVar147._12_4_;
                      fVar210 = local_1ab8._0_4_ - fVar74;
                      fVar217 = local_1ab8._4_4_ - fVar137;
                      fVar232 = local_1ab8._8_4_ - fVar146;
                      fVar233 = local_1ab8._12_4_ - fVar140;
                      fVar234 = auVar226._0_4_ - fVar154;
                      fVar47 = auVar226._4_4_ - fVar142;
                      fVar70 = auVar226._8_4_ - fVar144;
                      fVar73 = auVar226._12_4_ - fVar156;
                      local_1a08 = local_1a08 - fVar158;
                      fStack_1a04 = fStack_1a04 - fVar181;
                      fStack_1a00 = fStack_1a00 - fVar221;
                      fStack_19fc = fStack_19fc - fVar222;
                      fVar196 = fVar196 - fVar74;
                      fVar201 = fVar201 - fVar137;
                      fVar204 = fVar204 - fVar146;
                      fVar207 = fVar207 - fVar140;
                      fVar99 = fVar99 - fVar154;
                      fVar112 = fVar112 - fVar142;
                      fVar114 = fVar114 - fVar144;
                      fVar116 = fVar116 - fVar156;
                      fVar209 = fVar209 - fVar158;
                      fVar215 = fVar215 - fVar181;
                      fVar218 = fVar218 - fVar221;
                      fVar219 = fVar219 - fVar222;
                      fVar45 = fVar45 - fVar74;
                      fVar68 = fVar68 - fVar137;
                      fVar71 = fVar71 - fVar146;
                      fVar160 = fVar160 - fVar140;
                      fVar177 = fVar177 - fVar154;
                      fVar179 = fVar179 - fVar142;
                      fVar216 = fVar216 - fVar144;
                      fVar220 = fVar220 - fVar156;
                      fVar166 = fVar166 - fVar158;
                      fVar168 = fVar168 - fVar181;
                      fVar170 = fVar170 - fVar221;
                      fVar172 = fVar172 - fVar222;
                      fVar181 = fVar45 - fVar210;
                      fVar221 = fVar68 - fVar217;
                      fVar222 = fVar71 - fVar232;
                      fVar162 = fVar160 - fVar233;
                      fVar76 = fVar177 - fVar234;
                      fVar78 = fVar179 - fVar47;
                      fVar94 = fVar216 - fVar70;
                      fVar96 = fVar220 - fVar73;
                      fVar46 = fVar166 - local_1a08;
                      fVar69 = fVar168 - fStack_1a04;
                      fVar72 = fVar170 - fStack_1a00;
                      fVar75 = fVar172 - fStack_19fc;
                      auVar23 = *(undefined1 (*) [12])(ray + 0x60);
                      fVar74 = *(float *)(ray + 0x6c);
                      fVar77 = fVar210 - fVar196;
                      fVar93 = fVar217 - fVar201;
                      fVar95 = fVar232 - fVar204;
                      fVar97 = fVar233 - fVar207;
                      local_19e8 = (float)*(undefined8 *)(ray + 0x50);
                      fStack_19e4 = (float)((ulong)*(undefined8 *)(ray + 0x50) >> 0x20);
                      fStack_19e0 = (float)*(undefined8 *)(ray + 0x58);
                      fStack_19dc = (float)((ulong)*(undefined8 *)(ray + 0x58) >> 0x20);
                      auVar56._4_4_ = fVar112;
                      auVar56._0_4_ = fVar99;
                      auVar56._8_4_ = fVar114;
                      auVar56._12_4_ = fVar116;
                      auVar55._0_4_ = fVar234 - fVar99;
                      auVar55._4_4_ = fVar47 - fVar112;
                      auVar55._8_4_ = fVar70 - fVar114;
                      auVar55._12_4_ = fVar73 - fVar116;
                      fVar211 = (fVar76 * (fVar166 + local_1a08) - (fVar177 + fVar234) * fVar46) *
                                fVar155 + ((fVar45 + fVar210) * fVar46 -
                                          (fVar166 + local_1a08) * fVar181) * local_19e8 +
                                          (fVar181 * (fVar177 + fVar234) -
                                          (fVar45 + fVar210) * fVar76) * *(float *)(ray + 0x60);
                      fVar230 = (fVar78 * (fVar168 + fStack_1a04) - (fVar179 + fVar47) * fVar69) *
                                fVar157 + ((fVar68 + fVar217) * fVar69 -
                                          (fVar168 + fStack_1a04) * fVar221) * fStack_19e4 +
                                          (fVar221 * (fVar179 + fVar47) -
                                          (fVar68 + fVar217) * fVar78) * *(float *)(ray + 100);
                      auVar214._0_8_ = CONCAT44(fVar230,fVar211);
                      auVar214._8_4_ =
                           (fVar94 * (fVar170 + fStack_1a00) - (fVar216 + fVar70) * fVar72) *
                           fVar159 + ((fVar71 + fVar232) * fVar72 -
                                     (fVar170 + fStack_1a00) * fVar222) * fStack_19e0 +
                                     (fVar222 * (fVar216 + fVar70) - (fVar71 + fVar232) * fVar94) *
                                     *(float *)(ray + 0x68);
                      auVar214._12_4_ =
                           (fVar96 * (fVar172 + fStack_19fc) - (fVar220 + fVar73) * fVar75) *
                           fVar208 + ((fVar160 + fVar233) * fVar75 -
                                     (fVar172 + fStack_19fc) * fVar162) * fStack_19dc +
                                     (fVar162 * (fVar220 + fVar73) - (fVar160 + fVar233) * fVar96) *
                                     fVar74;
                      in_XMM14._0_4_ = local_1a08 - fVar209;
                      in_XMM14._4_4_ = fStack_1a04 - fVar215;
                      in_XMM14._8_4_ = fStack_1a00 - fVar218;
                      in_XMM14._12_4_ = fStack_19fc - fVar219;
                      local_1a28 = auVar23._0_4_;
                      fStack_1a24 = auVar23._4_4_;
                      fStack_1a20 = auVar23._8_4_;
                      auVar151._0_4_ =
                           (auVar55._0_4_ * (local_1a08 + fVar209) -
                           (fVar234 + fVar99) * in_XMM14._0_4_) * fVar155 +
                           ((fVar210 + fVar196) * in_XMM14._0_4_ - (local_1a08 + fVar209) * fVar77)
                           * local_19e8 +
                           (fVar77 * (fVar234 + fVar99) - (fVar210 + fVar196) * auVar55._0_4_) *
                           local_1a28;
                      auVar151._4_4_ =
                           (auVar55._4_4_ * (fStack_1a04 + fVar215) -
                           (fVar47 + fVar112) * in_XMM14._4_4_) * fVar157 +
                           ((fVar217 + fVar201) * in_XMM14._4_4_ - (fStack_1a04 + fVar215) * fVar93)
                           * fStack_19e4 +
                           (fVar93 * (fVar47 + fVar112) - (fVar217 + fVar201) * auVar55._4_4_) *
                           fStack_1a24;
                      auVar151._8_4_ =
                           (auVar55._8_4_ * (fStack_1a00 + fVar218) -
                           (fVar70 + fVar114) * in_XMM14._8_4_) * fVar159 +
                           ((fVar232 + fVar204) * in_XMM14._8_4_ - (fStack_1a00 + fVar218) * fVar95)
                           * fStack_19e0 +
                           (fVar95 * (fVar70 + fVar114) - (fVar232 + fVar204) * auVar55._8_4_) *
                           fStack_1a20;
                      auVar151._12_4_ =
                           (auVar55._12_4_ * (fStack_19fc + fVar219) -
                           (fVar73 + fVar116) * in_XMM14._12_4_) * fVar208 +
                           ((fVar233 + fVar207) * in_XMM14._12_4_ - (fStack_19fc + fVar219) * fVar97
                           ) * fStack_19dc +
                           (fVar97 * (fVar73 + fVar116) - (fVar233 + fVar207) * auVar55._12_4_) *
                           fVar74;
                      fVar137 = fVar196 - fVar45;
                      fVar146 = fVar201 - fVar68;
                      fVar140 = fVar204 - fVar71;
                      fVar154 = fVar207 - fVar160;
                      aVar120._0_4_ = fVar99 - fVar177;
                      aVar120._4_4_ = fVar112 - fVar179;
                      aVar120._8_4_ = fVar114 - fVar216;
                      aVar120._12_4_ = fVar116 - fVar220;
                      fVar142 = fVar209 - fVar166;
                      fVar144 = fVar215 - fVar168;
                      fVar156 = fVar218 - fVar170;
                      fVar158 = fVar219 - fVar172;
                      auVar62._0_4_ =
                           (aVar120._0_4_ * (fVar166 + fVar209) - (fVar177 + fVar99) * fVar142) *
                           fVar155 + ((fVar45 + fVar196) * fVar142 - (fVar166 + fVar209) * fVar137)
                                     * local_19e8 +
                                     (fVar137 * (fVar177 + fVar99) -
                                     (fVar45 + fVar196) * aVar120._0_4_) * local_1a28;
                      auVar62._4_4_ =
                           (aVar120._4_4_ * (fVar168 + fVar215) - (fVar179 + fVar112) * fVar144) *
                           fVar157 + ((fVar68 + fVar201) * fVar144 - (fVar168 + fVar215) * fVar146)
                                     * fStack_19e4 +
                                     (fVar146 * (fVar179 + fVar112) -
                                     (fVar68 + fVar201) * aVar120._4_4_) * fStack_1a24;
                      auVar62._8_4_ =
                           (aVar120._8_4_ * (fVar170 + fVar218) - (fVar216 + fVar114) * fVar156) *
                           fVar159 + ((fVar71 + fVar204) * fVar156 - (fVar170 + fVar218) * fVar140)
                                     * fStack_19e0 +
                                     (fVar140 * (fVar216 + fVar114) -
                                     (fVar71 + fVar204) * aVar120._8_4_) * fStack_1a20;
                      auVar62._12_4_ =
                           (aVar120._12_4_ * (fVar172 + fVar219) - (fVar220 + fVar116) * fVar158) *
                           fVar208 + ((fVar160 + fVar207) * fVar158 - (fVar172 + fVar219) * fVar154)
                                     * fStack_19dc +
                                     (fVar154 * (fVar220 + fVar116) -
                                     (fVar160 + fVar207) * aVar120._12_4_) * fVar74;
                      auVar106._0_4_ = fVar211 + auVar151._0_4_ + auVar62._0_4_;
                      auVar106._4_4_ = fVar230 + auVar151._4_4_ + auVar62._4_4_;
                      auVar106._8_4_ = auVar214._8_4_ + auVar151._8_4_ + auVar62._8_4_;
                      auVar106._12_4_ = auVar214._12_4_ + auVar151._12_4_ + auVar62._12_4_;
                      auVar85._8_4_ = auVar214._8_4_;
                      auVar85._0_8_ = auVar214._0_8_;
                      auVar85._12_4_ = auVar214._12_4_;
                      auVar86 = minps(auVar85,auVar151);
                      auVar86 = minps(auVar86,auVar62);
                      auVar122._8_4_ = auVar214._8_4_;
                      auVar122._0_8_ = auVar214._0_8_;
                      auVar122._12_4_ = auVar214._12_4_;
                      auVar101 = maxps(auVar122,auVar151);
                      auVar101 = maxps(auVar101,auVar62);
                      uVar195 = (uint)DAT_01f7b6c0;
                      uVar200 = DAT_01f7b6c0._4_4_;
                      uVar203 = DAT_01f7b6c0._8_4_;
                      uVar206 = DAT_01f7b6c0._12_4_;
                      fVar209 = (float)((uint)auVar106._0_4_ & uVar195) * 1.1920929e-07;
                      fVar215 = (float)((uint)auVar106._4_4_ & uVar200) * 1.1920929e-07;
                      fVar218 = (float)((uint)auVar106._8_4_ & uVar203) * 1.1920929e-07;
                      fVar219 = (float)((uint)auVar106._12_4_ & uVar206) * 1.1920929e-07;
                      auVar123._4_4_ = -(uint)(auVar101._4_4_ <= fVar215);
                      auVar123._0_4_ = -(uint)(auVar101._0_4_ <= fVar209);
                      auVar123._8_4_ = -(uint)(auVar101._8_4_ <= fVar218);
                      auVar123._12_4_ = -(uint)(auVar101._12_4_ <= fVar219);
                      auVar87._4_4_ = -(uint)(-fVar215 <= auVar86._4_4_);
                      auVar87._0_4_ = -(uint)(-fVar209 <= auVar86._0_4_);
                      auVar87._8_4_ = -(uint)(-fVar218 <= auVar86._8_4_);
                      auVar87._12_4_ = -(uint)(-fVar219 <= auVar86._12_4_);
                      auVar123 = auVar123 | auVar87;
                      auVar124._0_4_ = auVar123._0_4_ & auVar90._0_4_;
                      auVar124._4_4_ = auVar123._4_4_ & auVar90._4_4_;
                      auVar124._8_4_ = auVar123._8_4_ & auVar90._8_4_;
                      auVar124._12_4_ = auVar123._12_4_ & auVar90._12_4_;
                      iVar33 = movmskps(uVar192,auVar124);
                      aVar237 = _DAT_01f7a9f0;
                      if (iVar33 == 0) {
                        uVar192 = 0;
                        _local_1ab8 = auVar214;
                        in_XMM14 = (undefined1  [16])aVar120;
                      }
                      else {
                        fVar209 = fVar137 * auVar55._0_4_;
                        fVar215 = fVar146 * auVar55._4_4_;
                        fVar218 = fVar140 * auVar55._8_4_;
                        fVar219 = fVar154 * auVar55._12_4_;
                        local_1ab8._0_4_ = fVar76 * in_XMM14._0_4_ - auVar55._0_4_ * fVar46;
                        local_1ab8._4_4_ = fVar78 * in_XMM14._4_4_ - auVar55._4_4_ * fVar69;
                        fStack_1ab0 = fVar94 * in_XMM14._8_4_ - auVar55._8_4_ * fVar72;
                        fStack_1aac = fVar96 * in_XMM14._12_4_ - auVar55._12_4_ * fVar75;
                        fVar99 = fVar181 * auVar55._0_4_;
                        fVar112 = fVar221 * auVar55._4_4_;
                        fVar114 = fVar222 * auVar55._8_4_;
                        fVar116 = fVar162 * auVar55._12_4_;
                        auVar56._4_4_ = fVar144;
                        auVar56._0_4_ = fVar142;
                        auVar56._8_4_ = fVar156;
                        auVar56._12_4_ = fVar158;
                        auVar164._0_4_ = auVar55._0_4_ * fVar142 - aVar120._0_4_ * in_XMM14._0_4_;
                        auVar164._4_4_ = auVar55._4_4_ * fVar144 - aVar120._4_4_ * in_XMM14._4_4_;
                        auVar164._8_4_ = auVar55._8_4_ * fVar156 - aVar120._8_4_ * in_XMM14._8_4_;
                        auVar164._12_4_ =
                             auVar55._12_4_ * fVar158 - aVar120._12_4_ * in_XMM14._12_4_;
                        auVar63._4_4_ =
                             -(uint)((float)((uint)(auVar55._4_4_ * fVar69) & uVar200) <
                                    (float)((uint)(aVar120._4_4_ * in_XMM14._4_4_) & uVar200));
                        auVar63._0_4_ =
                             -(uint)((float)((uint)(auVar55._0_4_ * fVar46) & uVar195) <
                                    (float)((uint)(aVar120._0_4_ * in_XMM14._0_4_) & uVar195));
                        auVar63._8_4_ =
                             -(uint)((float)((uint)(auVar55._8_4_ * fVar72) & uVar203) <
                                    (float)((uint)(aVar120._8_4_ * in_XMM14._8_4_) & uVar203));
                        auVar63._12_4_ =
                             -(uint)((float)((uint)(auVar55._12_4_ * fVar75) & uVar206) <
                                    (float)((uint)(aVar120._12_4_ * in_XMM14._12_4_) & uVar206));
                        auVar55 = blendvps(auVar164,_local_1ab8,auVar63);
                        auVar187._0_4_ = fVar137 * in_XMM14._0_4_ - fVar77 * fVar142;
                        auVar187._4_4_ = fVar146 * in_XMM14._4_4_ - fVar93 * fVar144;
                        auVar187._8_4_ = fVar140 * in_XMM14._8_4_ - fVar95 * fVar156;
                        auVar187._12_4_ = fVar154 * in_XMM14._12_4_ - fVar97 * fVar158;
                        auVar64._4_4_ =
                             -(uint)((float)((uint)(fVar221 * in_XMM14._4_4_) & uVar200) <
                                    (float)((uint)(fVar93 * fVar144) & uVar200));
                        auVar64._0_4_ =
                             -(uint)((float)((uint)(fVar181 * in_XMM14._0_4_) & uVar195) <
                                    (float)((uint)(fVar77 * fVar142) & uVar195));
                        auVar64._8_4_ =
                             -(uint)((float)((uint)(fVar222 * in_XMM14._8_4_) & uVar203) <
                                    (float)((uint)(fVar95 * fVar156) & uVar203));
                        auVar64._12_4_ =
                             -(uint)((float)((uint)(fVar162 * in_XMM14._12_4_) & uVar206) <
                                    (float)((uint)(fVar97 * fVar158) & uVar206));
                        auVar17._4_4_ = fVar69 * fVar93 - fVar221 * in_XMM14._4_4_;
                        auVar17._0_4_ = fVar46 * fVar77 - fVar181 * in_XMM14._0_4_;
                        auVar17._8_4_ = fVar72 * fVar95 - fVar222 * in_XMM14._8_4_;
                        auVar17._12_4_ = fVar75 * fVar97 - fVar162 * in_XMM14._12_4_;
                        auVar101 = blendvps(auVar187,auVar17,auVar64);
                        auVar176._0_4_ = fVar99 - fVar77 * fVar76;
                        auVar176._4_4_ = fVar112 - fVar93 * fVar78;
                        auVar176._8_4_ = fVar114 - fVar95 * fVar94;
                        auVar176._12_4_ = fVar116 - fVar97 * fVar96;
                        auVar236._0_4_ = fVar77 * aVar120._0_4_ - fVar209;
                        auVar236._4_4_ = fVar93 * aVar120._4_4_ - fVar215;
                        auVar236._8_4_ = fVar95 * aVar120._8_4_ - fVar218;
                        auVar236._12_4_ = fVar97 * aVar120._12_4_ - fVar219;
                        auVar65._4_4_ =
                             -(uint)((float)((uint)(fVar93 * fVar78) & uVar200) <
                                    (float)((uint)fVar215 & uVar200));
                        auVar65._0_4_ =
                             -(uint)((float)((uint)(fVar77 * fVar76) & uVar195) <
                                    (float)((uint)fVar209 & uVar195));
                        auVar65._8_4_ =
                             -(uint)((float)((uint)(fVar95 * fVar94) & uVar203) <
                                    (float)((uint)fVar218 & uVar203));
                        auVar65._12_4_ =
                             -(uint)((float)((uint)(fVar97 * fVar96) & uVar206) <
                                    (float)((uint)fVar219 & uVar206));
                        auVar174 = blendvps(auVar236,auVar176,auVar65);
                        fVar209 = fVar155 * auVar55._0_4_ +
                                  local_19e8 * auVar101._0_4_ + local_1a28 * auVar174._0_4_;
                        fVar215 = fVar157 * auVar55._4_4_ +
                                  fStack_19e4 * auVar101._4_4_ + fStack_1a24 * auVar174._4_4_;
                        fVar218 = fVar159 * auVar55._8_4_ +
                                  fStack_19e0 * auVar101._8_4_ + fStack_1a20 * auVar174._8_4_;
                        fVar219 = fVar208 * auVar55._12_4_ +
                                  fStack_19dc * auVar101._12_4_ + fVar74 * auVar174._12_4_;
                        auVar197._0_4_ = fVar209 + fVar209;
                        auVar197._4_4_ = fVar215 + fVar215;
                        auVar197._8_4_ = fVar218 + fVar218;
                        auVar197._12_4_ = fVar219 + fVar219;
                        auVar66._0_4_ = local_1a08 * auVar174._0_4_;
                        auVar66._4_4_ = fStack_1a04 * auVar174._4_4_;
                        auVar66._8_4_ = fStack_1a00 * auVar174._8_4_;
                        auVar66._12_4_ = fStack_19fc * auVar174._12_4_;
                        fVar74 = fVar210 * auVar55._0_4_ + fVar234 * auVar101._0_4_ + auVar66._0_4_;
                        fVar137 = fVar217 * auVar55._4_4_ + fVar47 * auVar101._4_4_ + auVar66._4_4_;
                        fVar146 = fVar232 * auVar55._8_4_ + fVar70 * auVar101._8_4_ + auVar66._8_4_;
                        fVar140 = fVar233 * auVar55._12_4_ +
                                  fVar73 * auVar101._12_4_ + auVar66._12_4_;
                        auVar147 = rcpps(auVar66,auVar197);
                        fVar209 = auVar147._0_4_;
                        fVar215 = auVar147._4_4_;
                        fVar218 = auVar147._8_4_;
                        fVar219 = auVar147._12_4_;
                        auVar107._0_4_ =
                             ((1.0 - auVar197._0_4_ * fVar209) * fVar209 + fVar209) *
                             (fVar74 + fVar74);
                        auVar107._4_4_ =
                             ((1.0 - auVar197._4_4_ * fVar215) * fVar215 + fVar215) *
                             (fVar137 + fVar137);
                        auVar107._8_4_ =
                             ((1.0 - auVar197._8_4_ * fVar218) * fVar218 + fVar218) *
                             (fVar146 + fVar146);
                        auVar107._12_4_ =
                             ((1.0 - auVar197._12_4_ * fVar219) * fVar219 + fVar219) *
                             (fVar140 + fVar140);
                        auVar86 = *(undefined1 (*) [16])(ray + 0x80);
                        auVar198._0_4_ =
                             (int)((uint)(auVar197._0_4_ != 0.0 &&
                                         (auVar107._0_4_ <= auVar86._0_4_ &&
                                         *(float *)(ray + 0x30) <= auVar107._0_4_)) * -0x80000000)
                             >> 0x1f;
                        auVar198._4_4_ =
                             (int)((uint)(auVar197._4_4_ != 0.0 &&
                                         (auVar107._4_4_ <= auVar86._4_4_ &&
                                         *(float *)(ray + 0x34) <= auVar107._4_4_)) * -0x80000000)
                             >> 0x1f;
                        auVar198._8_4_ =
                             (int)((uint)(auVar197._8_4_ != 0.0 &&
                                         (auVar107._8_4_ <= auVar86._8_4_ &&
                                         *(float *)(ray + 0x38) <= auVar107._8_4_)) * -0x80000000)
                             >> 0x1f;
                        auVar198._12_4_ =
                             (int)((uint)(auVar197._12_4_ != 0.0 &&
                                         (auVar107._12_4_ <= auVar86._12_4_ &&
                                         *(float *)(ray + 0x3c) <= auVar107._12_4_)) * -0x80000000)
                             >> 0x1f;
                        auVar147 = auVar198 & auVar124;
                        iVar33 = movmskps(iVar33,auVar147);
                        _local_19a8 = aVar120;
                        if (iVar33 == 0) {
                          uVar192 = 0;
                        }
                        else {
                          uVar192 = *(uint *)(lVar34 + 0x40 + uVar42 * 4);
                          pRVar7 = (context->scene->geometries).items;
                          pGVar5 = pRVar7[uVar192].ptr;
                          uVar3 = pGVar5->mask;
                          auVar88._0_4_ = -(uint)((uVar3 & *(uint *)(ray + 0x90)) == 0);
                          auVar88._4_4_ = -(uint)((uVar3 & *(uint *)(ray + 0x94)) == 0);
                          auVar88._8_4_ = -(uint)((uVar3 & *(uint *)(ray + 0x98)) == 0);
                          auVar88._12_4_ = -(uint)((uVar3 & *(uint *)(ray + 0x9c)) == 0);
                          aVar89 = (anon_union_16_2_9473010e_for_vint_impl<4>_1)
                                   (~auVar88 & auVar147);
                          iVar33 = movmskps((int)pRVar7,(undefined1  [16])aVar89);
                          if (iVar33 != 0) {
                            if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                               (pGVar5->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
                              auVar56 = rcpps(ZEXT416(uVar3),auVar106);
                              fVar209 = auVar56._0_4_;
                              fVar215 = auVar56._4_4_;
                              fVar218 = auVar56._8_4_;
                              fVar219 = auVar56._12_4_;
                              fVar137 = (float)DAT_01f7ba10;
                              fVar146 = DAT_01f7ba10._4_4_;
                              fVar140 = DAT_01f7ba10._12_4_;
                              fVar74 = DAT_01f7ba10._8_4_;
                              fVar209 = (float)(-(uint)(1e-18 <= (float)((uint)auVar106._0_4_ &
                                                                        uVar195)) &
                                               (uint)((fVar137 - auVar106._0_4_ * fVar209) * fVar209
                                                     + fVar209));
                              fVar215 = (float)(-(uint)(1e-18 <= (float)((uint)auVar106._4_4_ &
                                                                        uVar200)) &
                                               (uint)((fVar146 - auVar106._4_4_ * fVar215) * fVar215
                                                     + fVar215));
                              fVar218 = (float)(-(uint)(1e-18 <= (float)((uint)auVar106._8_4_ &
                                                                        uVar203)) &
                                               (uint)((fVar74 - auVar106._8_4_ * fVar218) * fVar218
                                                     + fVar218));
                              fVar219 = (float)(-(uint)(1e-18 <= (float)((uint)auVar106._12_4_ &
                                                                        uVar206)) &
                                               (uint)((fVar140 - auVar106._12_4_ * fVar219) *
                                                      fVar219 + fVar219));
                              auVar153._0_4_ = fVar211 * fVar209;
                              auVar153._4_4_ = fVar230 * fVar215;
                              auVar153._8_4_ = auVar214._8_4_ * fVar218;
                              auVar153._12_4_ = auVar214._12_4_ * fVar219;
                              auVar56 = minps(auVar153,_DAT_01f7ba10);
                              auVar188._0_4_ = auVar151._0_4_ * fVar209;
                              auVar188._4_4_ = auVar151._4_4_ * fVar215;
                              auVar188._8_4_ = auVar151._8_4_ * fVar218;
                              auVar188._12_4_ = auVar151._12_4_ * fVar219;
                              auVar119 = minps(auVar188,_DAT_01f7ba10);
                              auVar126._0_4_ = fVar137 - auVar56._0_4_;
                              auVar126._4_4_ = fVar146 - auVar56._4_4_;
                              auVar126._8_4_ = fVar74 - auVar56._8_4_;
                              auVar126._12_4_ = fVar140 - auVar56._12_4_;
                              auVar21._8_8_ = uVar27;
                              auVar21._0_8_ = uVar26;
                              blendvps(auVar56,auVar126,auVar21);
                              auVar56._0_4_ = fVar137 - auVar119._0_4_;
                              auVar56._4_4_ = fVar146 - auVar119._4_4_;
                              auVar56._8_4_ = fVar74 - auVar119._8_4_;
                              auVar56._12_4_ = fVar140 - auVar119._12_4_;
                              blendvps(auVar119,auVar56,auVar21);
                              p0.field_0._0_16_ = auVar55;
                              p0.field_0._16_16_ = auVar101;
                              p0.field_0._32_16_ = auVar174;
                              auVar174 = blendvps(auVar86,auVar107,(undefined1  [16])aVar89);
                              *(undefined1 (*) [16])(ray + 0x80) = auVar174;
                              itime.field_0 = aVar89;
                              p1.field_0._0_4_ = SUB84(&itime,0);
                              p1.field_0._4_4_ = (undefined4)((ulong)&itime >> 0x20);
                              p1.field_0._8_4_ = SUB84(pGVar5->userPtr,0);
                              p1.field_0._12_4_ = (undefined4)((ulong)pGVar5->userPtr >> 0x20);
                              p1.field_0._16_8_ = context->user;
                              p1.field_0._24_8_ = ray;
                              p1.field_0._32_8_ = &p0;
                              p1.field_0._40_4_ = 4;
                              uVar31 = pGVar5->occlusionFilterN;
                              p1.field_0._0_8_ = &itime;
                              if ((RTCFilterFunctionN)uVar31 != (RTCFilterFunctionN)0x0) {
                                valid_i = (vint<4> *)&p1;
                                uVar31 = (*(code *)uVar31)((RTCFilterFunctionNArguments *)valid_i);
                                aVar102 = _DAT_01f7a9f0;
                              }
                              if (itime.field_0 == (anon_union_16_2_9473010e_for_vint_impl<4>_1)0x0)
                              {
                                auVar108._8_4_ = 0xffffffff;
                                auVar108._0_8_ = 0xffffffffffffffff;
                                auVar108._12_4_ = 0xffffffff;
                                auVar108 = auVar108 ^ _DAT_01f7ae20;
                              }
                              else {
                                p_Var8 = context->args->filter;
                                if ((p_Var8 != (RTCFilterFunctionN)0x0) &&
                                   (((context->args->flags &
                                     RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                                     RTC_RAY_QUERY_FLAG_INCOHERENT ||
                                    (((pGVar5->field_8).field_0x2 & 0x40) != 0)))) {
                                  valid_i = (vint<4> *)&p1;
                                  (*p_Var8)((RTCFilterFunctionNArguments *)valid_i);
                                  aVar102 = _DAT_01f7a9f0;
                                }
                                auVar91._0_4_ = -(uint)(itime.field_0._0_4_ == 0);
                                auVar91._4_4_ = -(uint)(itime.field_0._4_4_ == 0);
                                auVar91._8_4_ = -(uint)(itime.field_0._8_4_ == 0);
                                auVar91._12_4_ = -(uint)(itime.field_0._12_4_ == 0);
                                auVar108 = auVar91 ^ _DAT_01f7ae20;
                                auVar174 = blendvps(_DAT_01f7aa00,
                                                    *(undefined1 (*) [16])(p1.field_0._24_8_ + 0x80)
                                                    ,auVar91);
                                *(undefined1 (*) [16])(p1.field_0._24_8_ + 0x80) = auVar174;
                                uVar31 = p1.field_0._24_8_;
                              }
                              uVar192 = (uint)uVar31;
                              auVar109._0_4_ = auVar108._0_4_ << 0x1f;
                              auVar109._4_4_ = auVar108._4_4_ << 0x1f;
                              auVar109._8_4_ = auVar108._8_4_ << 0x1f;
                              auVar109._12_4_ = auVar108._12_4_ << 0x1f;
                              aVar89._0_4_ = auVar109._0_4_ >> 0x1f;
                              aVar89._4_4_ = auVar109._4_4_ >> 0x1f;
                              aVar89._8_4_ = auVar109._8_4_ >> 0x1f;
                              aVar89._12_4_ = auVar109._12_4_ >> 0x1f;
                              auVar86 = blendvps(auVar86,*(undefined1 (*) [16])(ray + 0x80),auVar109
                                                );
                              *(undefined1 (*) [16])(ray + 0x80) = auVar86;
                            }
                            auVar90 = ~(undefined1  [16])aVar89 & auVar90;
                            _local_1ab8 = auVar101;
                            aVar237 = aVar102;
                          }
                        }
                      }
                      uVar192 = movmskps(uVar192,auVar90);
                      uVar30 = (ulong)uVar192;
                      if ((uVar192 == 0) ||
                         (uVar30 = uVar42 + 1, bVar43 = 2 < uVar42, uVar42 = uVar30, bVar43)) break;
                    }
                    uVar199 = uVar199 & auVar90._0_4_;
                    uVar202 = uVar202 & auVar90._4_4_;
                    uVar205 = uVar205 & auVar90._8_4_;
                    uVar190 = uVar190 & auVar90._12_4_;
                    auVar18._4_4_ = uVar202;
                    auVar18._0_4_ = uVar199;
                    auVar18._8_4_ = uVar205;
                    auVar18._12_4_ = uVar190;
                    iVar33 = movmskps((int)uVar30,auVar18);
                  } while ((iVar33 != 0) && (uVar32 = uVar32 + 1, uVar32 < uVar29 - 8));
                  uVar28 = (undefined4)uVar32;
                  uVar199 = uVar199 ^ 0xffffffff;
                  uVar202 = uVar202 ^ 0xffffffff;
                  uVar205 = uVar205 ^ 0xffffffff;
                  uVar190 = uVar190 ^ 0xffffffff;
                }
                auVar19._4_4_ = uVar202;
                auVar19._0_4_ = uVar199;
                auVar19._8_4_ = uVar205;
                auVar19._12_4_ = uVar190;
                terminated.field_0 =
                     (anon_union_16_2_9473010e_for_vboolf_impl<4>_1)
                     ((undefined1  [16])terminated.field_0 | auVar19);
                uVar199 = movmskps(uVar28,(undefined1  [16])terminated.field_0);
                if (uVar199 == 0xf) goto LAB_0023c8d2;
                tray.tfar.field_0 =
                     (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                     blendvps((undefined1  [16])tray.tfar.field_0,_DAT_01f7aa00,
                              (undefined1  [16])terminated.field_0);
              }
              goto LAB_0023adce;
            }
            uVar29 = root.ptr & 0xfffffffffffffff0;
            lVar34 = -0x10;
            sVar35 = 8;
            aVar102 = aVar237;
            do {
              sVar4 = *(size_t *)(uVar29 + 0x20 + lVar34 * 2);
              root.ptr = sVar35;
              if (sVar4 == 8) break;
              fVar74 = *(float *)(uVar29 + 0x90 + lVar34);
              fVar137 = *(float *)(uVar29 + 0x30 + lVar34);
              fVar146 = *(float *)(uVar29 + 0x40 + lVar34);
              fVar140 = *(float *)(uVar29 + 0x50 + lVar34);
              fVar154 = *(float *)(uVar29 + 0x60 + lVar34);
              fVar99 = *(float *)(ray + 0x70);
              fVar112 = *(float *)(ray + 0x74);
              fVar114 = *(float *)(ray + 0x78);
              fVar116 = *(float *)(ray + 0x7c);
              fVar142 = *(float *)(uVar29 + 0xb0 + lVar34);
              fVar144 = *(float *)(uVar29 + 0xd0 + lVar34);
              fVar156 = *(float *)(uVar29 + 0x70 + lVar34);
              fVar158 = *(float *)(uVar29 + 0xa0 + lVar34);
              fVar181 = *(float *)(uVar29 + 0xc0 + lVar34);
              fVar221 = *(float *)(uVar29 + 0xe0 + lVar34);
              fVar222 = *(float *)(uVar29 + 0x80 + lVar34);
              unique0x10002355 = tray.org.field_0._40_8_;
              local_1ab8 = (undefined1  [8])tray.org.field_0._32_8_;
              fVar216 = (float)((ulong)tray.org.field_0._32_8_ >> 0x20);
              fVar220 = (float)((ulong)tray.org.field_0._40_8_ >> 0x20);
              fVar45 = ((fVar74 * fVar99 + fVar137) - (float)tray.org.field_0._0_4_) *
                       (float)tray.rdir.field_0._0_4_;
              fVar68 = ((fVar74 * fVar112 + fVar137) - (float)tray.org.field_0._4_4_) *
                       (float)tray.rdir.field_0._4_4_;
              fVar71 = ((fVar74 * fVar114 + fVar137) - (float)tray.org.field_0._8_4_) *
                       (float)tray.rdir.field_0._8_4_;
              fVar74 = ((fVar74 * fVar116 + fVar137) - (float)tray.org.field_0._12_4_) *
                       (float)tray.rdir.field_0._12_4_;
              auVar56._0_4_ =
                   ((fVar142 * fVar99 + fVar140) - (float)tray.org.field_0._16_4_) *
                   tray.rdir.field_0._16_4_;
              auVar56._4_4_ =
                   ((fVar142 * fVar112 + fVar140) - (float)tray.org.field_0._20_4_) *
                   tray.rdir.field_0._20_4_;
              auVar56._8_4_ =
                   ((fVar142 * fVar114 + fVar140) - (float)tray.org.field_0._24_4_) *
                   tray.rdir.field_0._24_4_;
              auVar56._12_4_ =
                   ((fVar142 * fVar116 + fVar140) - (float)tray.org.field_0._28_4_) *
                   tray.rdir.field_0._28_4_;
              fVar137 = ((fVar144 * fVar99 + fVar156) - (float)tray.org.field_0._32_8_) *
                        tray.rdir.field_0._32_4_;
              fVar140 = ((fVar144 * fVar112 + fVar156) - fVar216) * tray.rdir.field_0._36_4_;
              fVar142 = ((fVar144 * fVar114 + fVar156) - (float)tray.org.field_0._40_8_) *
                        tray.rdir.field_0._40_4_;
              fVar144 = ((fVar144 * fVar116 + fVar156) - fVar220) * tray.rdir.field_0._44_4_;
              fVar160 = ((fVar158 * fVar99 + fVar146) - (float)tray.org.field_0._0_4_) *
                        (float)tray.rdir.field_0._0_4_;
              fVar166 = ((fVar158 * fVar112 + fVar146) - (float)tray.org.field_0._4_4_) *
                        (float)tray.rdir.field_0._4_4_;
              fVar168 = ((fVar158 * fVar114 + fVar146) - (float)tray.org.field_0._8_4_) *
                        (float)tray.rdir.field_0._8_4_;
              fVar170 = ((fVar158 * fVar116 + fVar146) - (float)tray.org.field_0._12_4_) *
                        (float)tray.rdir.field_0._12_4_;
              fVar172 = ((fVar181 * fVar99 + fVar154) - (float)tray.org.field_0._16_4_) *
                        tray.rdir.field_0._16_4_;
              fVar177 = ((fVar181 * fVar112 + fVar154) - (float)tray.org.field_0._20_4_) *
                        tray.rdir.field_0._20_4_;
              fVar179 = ((fVar181 * fVar114 + fVar154) - (float)tray.org.field_0._24_4_) *
                        tray.rdir.field_0._24_4_;
              fVar181 = ((fVar181 * fVar116 + fVar154) - (float)tray.org.field_0._28_4_) *
                        tray.rdir.field_0._28_4_;
              fVar146 = ((fVar221 * fVar99 + fVar222) - (float)tray.org.field_0._32_8_) *
                        tray.rdir.field_0._32_4_;
              fVar154 = ((fVar221 * fVar112 + fVar222) - fVar216) * tray.rdir.field_0._36_4_;
              fVar156 = ((fVar221 * fVar114 + fVar222) - (float)tray.org.field_0._40_8_) *
                        tray.rdir.field_0._40_4_;
              fVar158 = ((fVar221 * fVar116 + fVar222) - fVar220) * tray.rdir.field_0._44_4_;
              uVar199 = (uint)((int)fVar160 < (int)fVar45) * (int)fVar160 |
                        (uint)((int)fVar160 >= (int)fVar45) * (int)fVar45;
              uVar205 = (uint)((int)fVar166 < (int)fVar68) * (int)fVar166 |
                        (uint)((int)fVar166 >= (int)fVar68) * (int)fVar68;
              uVar190 = (uint)((int)fVar168 < (int)fVar71) * (int)fVar168 |
                        (uint)((int)fVar168 >= (int)fVar71) * (int)fVar71;
              uVar192 = (uint)((int)fVar170 < (int)fVar74) * (int)fVar170 |
                        (uint)((int)fVar170 >= (int)fVar74) * (int)fVar74;
              uVar195 = (uint)((int)fVar172 < (int)auVar56._0_4_) * (int)fVar172 |
                        (uint)((int)fVar172 >= (int)auVar56._0_4_) * (int)auVar56._0_4_;
              uVar200 = (uint)((int)fVar177 < (int)auVar56._4_4_) * (int)fVar177 |
                        (uint)((int)fVar177 >= (int)auVar56._4_4_) * (int)auVar56._4_4_;
              uVar203 = (uint)((int)fVar179 < (int)auVar56._8_4_) * (int)fVar179 |
                        (uint)((int)fVar179 >= (int)auVar56._8_4_) * (int)auVar56._8_4_;
              uVar206 = (uint)((int)fVar181 < (int)auVar56._12_4_) * (int)fVar181 |
                        (uint)((int)fVar181 >= (int)auVar56._12_4_) * (int)auVar56._12_4_;
              auVar147._0_4_ =
                   (float)(((int)uVar195 < (int)uVar199) * uVar199 |
                          ((int)uVar195 >= (int)uVar199) * uVar195);
              auVar147._4_4_ =
                   (float)(((int)uVar200 < (int)uVar205) * uVar205 |
                          ((int)uVar200 >= (int)uVar205) * uVar200);
              auVar147._8_4_ =
                   (float)(((int)uVar203 < (int)uVar190) * uVar190 |
                          ((int)uVar203 >= (int)uVar190) * uVar203);
              auVar147._12_4_ =
                   (float)(((int)uVar206 < (int)uVar192) * uVar192 |
                          ((int)uVar206 >= (int)uVar192) * uVar206);
              uVar199 = (uint)((int)fVar146 < (int)fVar137) * (int)fVar146 |
                        (uint)((int)fVar146 >= (int)fVar137) * (int)fVar137;
              uVar205 = (uint)((int)fVar154 < (int)fVar140) * (int)fVar154 |
                        (uint)((int)fVar154 >= (int)fVar140) * (int)fVar140;
              uVar190 = (uint)((int)fVar156 < (int)fVar142) * (int)fVar156 |
                        (uint)((int)fVar156 >= (int)fVar142) * (int)fVar142;
              uVar192 = (uint)((int)fVar158 < (int)fVar144) * (int)fVar158 |
                        (uint)((int)fVar158 >= (int)fVar144) * (int)fVar144;
              auVar184._0_4_ =
                   (float)((uint)((int)uVar199 < (int)auVar147._0_4_) * (int)auVar147._0_4_ |
                          ((int)uVar199 >= (int)auVar147._0_4_) * uVar199) * 0.99999964;
              auVar184._4_4_ =
                   (float)((uint)((int)uVar205 < (int)auVar147._4_4_) * (int)auVar147._4_4_ |
                          ((int)uVar205 >= (int)auVar147._4_4_) * uVar205) * 0.99999964;
              auVar184._8_4_ =
                   (float)((uint)((int)uVar190 < (int)auVar147._8_4_) * (int)auVar147._8_4_ |
                          ((int)uVar190 >= (int)auVar147._8_4_) * uVar190) * 0.99999964;
              auVar184._12_4_ =
                   (float)((uint)((int)uVar192 < (int)auVar147._12_4_) * (int)auVar147._12_4_ |
                          ((int)uVar192 >= (int)auVar147._12_4_) * uVar192) * 0.99999964;
              auVar55._0_4_ =
                   (float)((uint)((int)fVar160 < (int)fVar45) * (int)fVar45 |
                          (uint)((int)fVar160 >= (int)fVar45) * (int)fVar160);
              auVar55._4_4_ =
                   (float)((uint)((int)fVar166 < (int)fVar68) * (int)fVar68 |
                          (uint)((int)fVar166 >= (int)fVar68) * (int)fVar166);
              auVar55._8_4_ =
                   (float)((uint)((int)fVar168 < (int)fVar71) * (int)fVar71 |
                          (uint)((int)fVar168 >= (int)fVar71) * (int)fVar168);
              auVar55._12_4_ =
                   (float)((uint)((int)fVar170 < (int)fVar74) * (int)fVar74 |
                          (uint)((int)fVar170 >= (int)fVar74) * (int)fVar170);
              uVar199 = (uint)((int)fVar172 < (int)auVar56._0_4_) * (int)auVar56._0_4_ |
                        (uint)((int)fVar172 >= (int)auVar56._0_4_) * (int)fVar172;
              uVar205 = (uint)((int)fVar177 < (int)auVar56._4_4_) * (int)auVar56._4_4_ |
                        (uint)((int)fVar177 >= (int)auVar56._4_4_) * (int)fVar177;
              uVar190 = (uint)((int)fVar179 < (int)auVar56._8_4_) * (int)auVar56._8_4_ |
                        (uint)((int)fVar179 >= (int)auVar56._8_4_) * (int)fVar179;
              uVar192 = (uint)((int)fVar181 < (int)auVar56._12_4_) * (int)auVar56._12_4_ |
                        (uint)((int)fVar181 >= (int)auVar56._12_4_) * (int)fVar181;
              uVar195 = (uint)((int)auVar55._0_4_ < (int)uVar199) * (int)auVar55._0_4_ |
                        ((int)auVar55._0_4_ >= (int)uVar199) * uVar199;
              uVar200 = (uint)((int)auVar55._4_4_ < (int)uVar205) * (int)auVar55._4_4_ |
                        ((int)auVar55._4_4_ >= (int)uVar205) * uVar205;
              uVar203 = (uint)((int)auVar55._8_4_ < (int)uVar190) * (int)auVar55._8_4_ |
                        ((int)auVar55._8_4_ >= (int)uVar190) * uVar190;
              uVar206 = (uint)((int)auVar55._12_4_ < (int)uVar192) * (int)auVar55._12_4_ |
                        ((int)auVar55._12_4_ >= (int)uVar192) * uVar192;
              uVar199 = (uint)((int)fVar146 < (int)fVar137) * (int)fVar137 |
                        (uint)((int)fVar146 >= (int)fVar137) * (int)fVar146;
              uVar205 = (uint)((int)fVar154 < (int)fVar140) * (int)fVar140 |
                        (uint)((int)fVar154 >= (int)fVar140) * (int)fVar154;
              uVar190 = (uint)((int)fVar156 < (int)fVar142) * (int)fVar142 |
                        (uint)((int)fVar156 >= (int)fVar142) * (int)fVar156;
              uVar192 = (uint)((int)fVar158 < (int)fVar144) * (int)fVar144 |
                        (uint)((int)fVar158 >= (int)fVar144) * (int)fVar158;
              fVar74 = (float)(((int)uVar195 < (int)uVar199) * uVar195 |
                              ((int)uVar195 >= (int)uVar199) * uVar199) * 1.0000004;
              fVar137 = (float)(((int)uVar200 < (int)uVar205) * uVar200 |
                               ((int)uVar200 >= (int)uVar205) * uVar205) * 1.0000004;
              fVar146 = (float)(((int)uVar203 < (int)uVar190) * uVar203 |
                               ((int)uVar203 >= (int)uVar190) * uVar190) * 1.0000004;
              fVar140 = (float)(((int)uVar206 < (int)uVar192) * uVar206 |
                               ((int)uVar206 >= (int)uVar192) * uVar192) * 1.0000004;
              bVar43 = (float)((uint)(tray.tnear.field_0.i[0] < (int)auVar184._0_4_) *
                               (int)auVar184._0_4_ |
                              (uint)(tray.tnear.field_0.i[0] >= (int)auVar184._0_4_) *
                              tray.tnear.field_0.i[0]) <=
                       (float)((uint)(tray.tfar.field_0.i[0] < (int)fVar74) * tray.tfar.field_0.i[0]
                              | (uint)(tray.tfar.field_0.i[0] >= (int)fVar74) * (int)fVar74);
              bVar10 = (float)((uint)(tray.tnear.field_0.i[1] < (int)auVar184._4_4_) *
                               (int)auVar184._4_4_ |
                              (uint)(tray.tnear.field_0.i[1] >= (int)auVar184._4_4_) *
                              tray.tnear.field_0.i[1]) <=
                       (float)((uint)(tray.tfar.field_0.i[1] < (int)fVar137) *
                               tray.tfar.field_0.i[1] |
                              (uint)(tray.tfar.field_0.i[1] >= (int)fVar137) * (int)fVar137);
              bVar11 = (float)((uint)(tray.tnear.field_0.i[2] < (int)auVar184._8_4_) *
                               (int)auVar184._8_4_ |
                              (uint)(tray.tnear.field_0.i[2] >= (int)auVar184._8_4_) *
                              tray.tnear.field_0.i[2]) <=
                       (float)((uint)(tray.tfar.field_0.i[2] < (int)fVar146) *
                               tray.tfar.field_0.i[2] |
                              (uint)(tray.tfar.field_0.i[2] >= (int)fVar146) * (int)fVar146);
              bVar12 = (float)((uint)(tray.tnear.field_0.i[3] < (int)auVar184._12_4_) *
                               (int)auVar184._12_4_ |
                              (uint)(tray.tnear.field_0.i[3] >= (int)auVar184._12_4_) *
                              tray.tnear.field_0.i[3]) <=
                       (float)((uint)(tray.tfar.field_0.i[3] < (int)fVar140) *
                               tray.tfar.field_0.i[3] |
                              (uint)(tray.tfar.field_0.i[3] >= (int)fVar140) * (int)fVar140);
              if ((uVar202 & 7) == 6) {
                fVar74 = *(float *)(uVar29 + 0xf0 + lVar34);
                fVar137 = *(float *)(uVar29 + 0x100 + lVar34);
                auVar56._4_4_ = (float)-(uint)(fVar74 <= fVar112);
                auVar56._0_4_ = (float)-(uint)(fVar74 <= fVar99);
                auVar56._8_4_ = (float)-(uint)(fVar74 <= fVar114);
                auVar56._12_4_ = (float)-(uint)(fVar74 <= fVar116);
                bVar43 = (fVar99 < fVar137 && fVar74 <= fVar99) && bVar43;
                bVar10 = (fVar112 < fVar137 && fVar74 <= fVar112) && bVar10;
                bVar11 = (fVar114 < fVar137 && fVar74 <= fVar114) && bVar11;
                bVar12 = (fVar116 < fVar137 && fVar74 <= fVar116) && bVar12;
              }
              auVar50._0_4_ = (-(uint)bVar43 & -(uint)(fVar209 < tray.tfar.field_0.v[0])) << 0x1f;
              auVar50._4_4_ = (-(uint)bVar10 & -(uint)(fVar215 < tray.tfar.field_0.v[1])) << 0x1f;
              auVar50._8_4_ = (-(uint)bVar11 & -(uint)(fVar218 < tray.tfar.field_0.v[2])) << 0x1f;
              auVar50._12_4_ = (-(uint)bVar12 & -(uint)(fVar219 < tray.tfar.field_0.v[3])) << 0x1f;
              uVar199 = movmskps((int)valid_i,auVar50);
              valid_i = (vint<4> *)(ulong)uVar199;
              aVar120 = aVar102;
              if ((uVar199 != 0) &&
                 (aVar120.v = (__m128)blendvps(aVar237.v,auVar184,auVar50), root.ptr = sVar4,
                 sVar35 != 8)) {
                pNVar40->ptr = sVar35;
                pNVar40 = pNVar40 + 1;
                *(anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *)paVar41->v = aVar102;
                paVar41 = paVar41 + 1;
              }
              aVar102 = aVar120;
              lVar34 = lVar34 + 4;
              sVar35 = root.ptr;
              in_XMM14 = (undefined1  [16])tray.rdir.field_0.field_0.z.field_0;
            } while (lVar34 != 0);
            if (root.ptr == 8) goto LAB_0023b0a1;
            auVar51._4_4_ = -(uint)(aVar102.v[1] < tray.tfar.field_0.v[1]);
            auVar51._0_4_ = -(uint)(aVar102.v[0] < tray.tfar.field_0.v[0]);
            auVar51._8_4_ = -(uint)(aVar102.v[2] < tray.tfar.field_0.v[2]);
            auVar51._12_4_ = -(uint)(aVar102.v[3] < tray.tfar.field_0.v[3]);
            uVar28 = movmskps((int)uVar29,auVar51);
            uVar199 = POPCOUNT(uVar28);
          } while ((byte)uVar194 < (byte)uVar199);
          pNVar40->ptr = root.ptr;
          pNVar40 = pNVar40 + 1;
          *(anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *)paVar41->v = aVar102;
          paVar41 = paVar41 + 1;
LAB_0023b0a1:
          uVar199 = 4;
        }
        else {
          do {
            sVar35 = 0;
            if (uVar29 != 0) {
              for (; (uVar29 >> sVar35 & 1) == 0; sVar35 = sVar35 + 1) {
              }
            }
            tray_00 = &tray;
            valid_i = (vint<4> *)This;
            bVar43 = occluded1(This,bvh,root,sVar35,&pre,ray,tray_00,context);
            if (bVar43) {
              *(undefined4 *)(local_19a8 + sVar35 * 4 + -0x10) = 0xffffffff;
            }
            uVar29 = uVar29 & uVar29 - 1;
          } while (uVar29 != 0);
          iVar33 = movmskps((int)tray_00,(undefined1  [16])terminated.field_0);
          uVar199 = 3;
          if (iVar33 != 0xf) {
            tray.tfar.field_0 =
                 (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                 blendvps((undefined1  [16])tray.tfar.field_0,_DAT_01f7aa00,
                          (undefined1  [16])terminated.field_0);
            uVar199 = 2;
          }
          aVar237 = _DAT_01f7a9f0;
          if (uVar194 < (uint)POPCOUNT(uVar202)) goto LAB_0023ae14;
        }
      } while (uVar199 != 3);
LAB_0023c8d2:
      auVar67._0_4_ = auVar79._0_4_ & terminated.field_0.i[0];
      auVar67._4_4_ = auVar79._4_4_ & terminated.field_0.i[1];
      auVar67._8_4_ = auVar79._8_4_ & terminated.field_0.i[2];
      auVar67._12_4_ = auVar79._12_4_ & terminated.field_0.i[3];
      auVar147 = blendvps(*(undefined1 (*) [16])(ray + 0x80),_DAT_01f7aa00,auVar67);
      *(undefined1 (*) [16])(ray + 0x80) = auVar147;
      return;
    }
  }
  return;
}

Assistant:

void BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::occluded(vint<K>* __restrict__ valid_i,
                                                                                              Accel::Intersectors* __restrict__ This,
                                                                                              RayK<K>& __restrict__ ray,
                                                                                              RayQueryContext* context)
    {
      BVH* __restrict__ bvh = (BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
      
#if ENABLE_FAST_COHERENT_CODEPATHS == 1
      assert(context);
      if (unlikely(types == BVH_AN1 && context->user && context->isCoherent()))
      {
        occludedCoherent(valid_i, This, ray, context);
        return;
      }
#endif

      /* filter out already occluded and invalid rays */
      vbool<K> valid = (*valid_i == -1) & (ray.tfar >= 0.0f);
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      valid &= ray.valid();
#endif

      /* return if there are no valid rays */
      const size_t valid_bits = movemask(valid);
      if (unlikely(valid_bits == 0)) return;

      /* verify correct input */
      assert(all(valid, ray.valid()));
      assert(all(valid, ray.tnear() >= 0.0f));
      assert(!(types & BVH_MB) || all(valid, (ray.time() >= 0.0f) & (ray.time() <= 1.0f)));
      Precalculations pre(valid, ray);

      /* load ray */
      TravRayK<K, robust> tray(ray.org, ray.dir, single ? N : 0);
      const vfloat<K> org_ray_tnear = max(ray.tnear(), 0.0f);
      const vfloat<K> org_ray_tfar  = max(ray.tfar , 0.0f);

      tray.tnear = select(valid, org_ray_tnear, vfloat<K>(pos_inf));
      tray.tfar  = select(valid, org_ray_tfar , vfloat<K>(neg_inf));

      vbool<K> terminated = !valid;
      const vfloat<K> inf = vfloat<K>(pos_inf);

      /* determine switch threshold based on flags */
      const size_t switchThreshold = (context->user && context->isCoherent()) ? 2 : switchThresholdIncoherent;

      /* allocate stack and push root node */
      vfloat<K> stack_near[stackSizeChunk];
      NodeRef stack_node[stackSizeChunk];
      stack_node[0] = BVH::invalidNode;
      stack_near[0] = inf;
      stack_node[1] = bvh->root;
      stack_near[1] = tray.tnear;
      NodeRef* stackEnd MAYBE_UNUSED = stack_node+stackSizeChunk;
      NodeRef* __restrict__ sptr_node = stack_node + 2;
      vfloat<K>* __restrict__ sptr_near = stack_near + 2;

      while (1) pop:
      {
        /* pop next node from stack */
        assert(sptr_node > stack_node);
        sptr_node--;
        sptr_near--;
        NodeRef cur = *sptr_node;
        if (unlikely(cur == BVH::invalidNode)) {
          assert(sptr_node == stack_node);
          break;
        }

        /* cull node if behind closest hit point */
        vfloat<K> curDist = *sptr_near;
        const vbool<K> active = curDist < tray.tfar;
        if (unlikely(none(active)))
          continue;

        /* switch to single ray traversal */
#if (!defined(__WIN32__) || defined(__X86_64__)) && ((defined(__aarch64__)) || defined(__SSE4_2__))
#if FORCE_SINGLE_MODE == 0
        if (single)
#endif
        {
          size_t bits = movemask(active);
#if FORCE_SINGLE_MODE == 0
          if (unlikely(popcnt(bits) <= switchThreshold)) 
#endif
          {
            for (; bits!=0; ) {
              const size_t i = bscf(bits);
              if (occluded1(This, bvh, cur, i, pre, ray, tray, context))
                set(terminated, i);
            }
            if (all(terminated)) break;
            tray.tfar = select(terminated, vfloat<K>(neg_inf), tray.tfar);
            continue;
          }
        }
#endif

        while (likely(!cur.isLeaf()))
        {
          /* process nodes */
          const vbool<K> valid_node = tray.tfar > curDist;
          STAT3(shadow.trav_nodes, 1, popcnt(valid_node), K);
          const NodeRef nodeRef = cur;
          const BaseNode* __restrict__ const node = nodeRef.baseNode();

          /* set cur to invalid */
          cur = BVH::emptyNode;
          curDist = pos_inf;

          for (unsigned i = 0; i < N; i++)
          {
            const NodeRef child = node->children[i];
            if (unlikely(child == BVH::emptyNode)) break;
            vfloat<K> lnearP;
            vbool<K> lhit = valid_node;
            BVHNNodeIntersectorK<N, K, types, robust>::intersect(nodeRef, i, tray, ray.time(), lnearP, lhit);

            /* if we hit the child we push the previously hit node onto the stack, and continue with the currently hit child */
            if (likely(any(lhit)))
            {
              assert(sptr_node < stackEnd);
              assert(child != BVH::emptyNode);
              const vfloat<K> childDist = select(lhit, lnearP, inf);

              /* push 'cur' node onto stack and continue with hit child */
              if (likely(cur != BVH::emptyNode)) {
                *sptr_node = cur; sptr_node++;
                *sptr_near = curDist; sptr_near++;
              }
              curDist = childDist;
              cur = child;
            }
          }
          if (unlikely(cur == BVH::emptyNode))
            goto pop;

#if SWITCH_DURING_DOWN_TRAVERSAL == 1
          if (single)
          {
            // seems to be the best place for testing utilization
            if (unlikely(popcnt(tray.tfar > curDist) <= switchThreshold))
            {
              *sptr_node++ = cur;
              *sptr_near++ = curDist;
              goto pop;
            }
          }
#endif
	}

        /* return if stack is empty */
        if (unlikely(cur == BVH::invalidNode)) {
          assert(sptr_node == stack_node);
          break;
        }


        /* intersect leaf */
        assert(cur != BVH::emptyNode);
        const vbool<K> valid_leaf = tray.tfar > curDist;
        STAT3(shadow.trav_leaves, 1, popcnt(valid_leaf), K);
        if (unlikely(none(valid_leaf))) continue;
        size_t items; const Primitive* prim = (Primitive*) cur.leaf(items);

        size_t lazy_node = 0;
        terminated |= PrimitiveIntersectorK::occluded(!terminated, This, pre, ray, context, prim, items, tray, lazy_node);
        if (all(terminated)) break;
        tray.tfar = select(terminated, vfloat<K>(neg_inf), tray.tfar); // ignore node intersections for terminated rays

        if (unlikely(lazy_node)) {
          *sptr_node = lazy_node; sptr_node++;
          *sptr_near = neg_inf;   sptr_near++;
        }
      }

      vfloat<K>::store(valid & terminated, &ray.tfar, neg_inf);
    }